

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx2::CurveNiMBIntersectorK<4,4>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  undefined1 (*pauVar3) [16];
  float *pfVar4;
  undefined1 (*pauVar5) [12];
  BBox1f BVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  uint uVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  int iVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [12];
  uint uVar57;
  uint uVar58;
  ulong uVar59;
  byte bVar60;
  uint uVar61;
  long lVar62;
  ulong uVar63;
  long lVar64;
  uint uVar65;
  float t1;
  float fVar66;
  float fVar67;
  undefined4 uVar68;
  float fVar95;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar96;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  float fVar97;
  undefined8 uVar98;
  vint4 ai_1;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 extraout_var [56];
  vint4 bi_2;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar143;
  float fVar145;
  float fVar164;
  float fVar165;
  vint4 bi_1;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar166;
  undefined1 auVar153 [16];
  float fVar144;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float fVar167;
  float fVar184;
  vint4 bi;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  float fVar185;
  float fVar200;
  vint4 ai;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  float fVar218;
  float fVar234;
  float fVar237;
  vint4 ai_2;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar239;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar235;
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  float fVar236;
  float fVar238;
  float fVar240;
  undefined1 auVar233 [32];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar246 [16];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar288 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  float fVar284;
  float fVar296;
  float fVar297;
  undefined1 auVar285 [16];
  float fVar298;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [32];
  __m128 a;
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar317 [16];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar331 [32];
  float local_658;
  float fStack_654;
  float fStack_650;
  undefined1 local_648 [8];
  undefined8 uStack_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  vfloat_impl<4> p00;
  undefined1 local_618 [8];
  float fStack_610;
  float fStack_60c;
  vfloat_impl<4> p01;
  vfloat_impl<4> p02;
  undefined1 local_568 [8];
  undefined8 uStack_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  undefined1 local_518 [32];
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_468 [16];
  undefined1 (*local_458) [16];
  Primitive *local_450;
  RTCFilterFunctionNArguments args;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  undefined4 local_3c8;
  undefined4 local_3b8;
  uint mask_stack [4];
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  RTCHitN local_248 [16];
  undefined1 local_238 [16];
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  BBox1f cv_stack [4];
  undefined1 auVar129 [64];
  undefined1 auVar330 [32];
  
  local_648[0] = prim[1];
  uVar59 = (ulong)(byte)local_648[0];
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 4 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 5 + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 6 + 6)));
  lVar62 = uVar59 * 0x25;
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0xf + 6)));
  auVar173 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)local_648[0] * 0x10 + 6)));
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x11 + 6)));
  auVar170 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x1a + 6)));
  auVar267 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x1b + 6)));
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x1c + 6)));
  auVar124 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar124 = vinsertps_avx(auVar124,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  fVar66 = *(float *)(prim + lVar62 + 0x12);
  auVar108 = vsubps_avx(auVar124,*(undefined1 (*) [16])(prim + lVar62 + 6));
  fVar97 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar62 + 0x16)) *
           *(float *)(prim + lVar62 + 0x1a);
  auVar124 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar323._0_4_ = fVar66 * auVar108._0_4_;
  auVar323._4_4_ = fVar66 * auVar108._4_4_;
  auVar323._8_4_ = fVar66 * auVar108._8_4_;
  auVar323._12_4_ = fVar66 * auVar108._12_4_;
  auVar99._0_4_ = fVar66 * auVar124._0_4_;
  auVar99._4_4_ = fVar66 * auVar124._4_4_;
  auVar99._8_4_ = fVar66 * auVar124._8_4_;
  auVar99._12_4_ = fVar66 * auVar124._12_4_;
  auVar124 = vcvtdq2ps_avx(auVar20);
  auVar16 = vcvtdq2ps_avx(auVar21);
  auVar20 = vcvtdq2ps_avx(auVar173);
  auVar21 = vcvtdq2ps_avx(auVar23);
  auVar173 = vcvtdq2ps_avx(auVar267);
  auVar23 = vcvtdq2ps_avx(auVar24);
  auVar267 = vshufps_avx(auVar99,auVar99,0x55);
  auVar24 = vshufps_avx(auVar99,auVar99,0xaa);
  fVar66 = auVar24._0_4_;
  auVar244._0_4_ = fVar66 * auVar16._0_4_;
  fVar95 = auVar24._4_4_;
  auVar244._4_4_ = fVar95 * auVar16._4_4_;
  fVar67 = auVar24._8_4_;
  auVar244._8_4_ = fVar67 * auVar16._8_4_;
  fVar145 = auVar24._12_4_;
  auVar244._12_4_ = fVar145 * auVar16._12_4_;
  auVar219._0_4_ = fVar66 * auVar21._0_4_;
  auVar219._4_4_ = fVar95 * auVar21._4_4_;
  auVar219._8_4_ = fVar67 * auVar21._8_4_;
  auVar219._12_4_ = fVar145 * auVar21._12_4_;
  auVar201._0_4_ = auVar23._0_4_ * fVar66;
  auVar201._4_4_ = auVar23._4_4_ * fVar95;
  auVar201._8_4_ = auVar23._8_4_ * fVar67;
  auVar201._12_4_ = auVar23._12_4_ * fVar145;
  auVar101 = vfmadd231ps_fma(auVar244,auVar267,auVar124);
  auVar102 = vfmadd231ps_fma(auVar219,auVar267,auVar20);
  auVar131 = vfmadd231ps_fma(auVar201,auVar173,auVar267);
  auVar267 = vshufps_avx(auVar323,auVar323,0xaa);
  fVar66 = auVar267._0_4_;
  auVar168._0_4_ = fVar66 * auVar16._0_4_;
  fVar95 = auVar267._4_4_;
  auVar168._4_4_ = fVar95 * auVar16._4_4_;
  fVar67 = auVar267._8_4_;
  auVar168._8_4_ = fVar67 * auVar16._8_4_;
  fVar145 = auVar267._12_4_;
  auVar168._12_4_ = fVar145 * auVar16._12_4_;
  auVar146._0_4_ = fVar66 * auVar21._0_4_;
  auVar146._4_4_ = fVar95 * auVar21._4_4_;
  auVar146._8_4_ = fVar67 * auVar21._8_4_;
  auVar146._12_4_ = fVar145 * auVar21._12_4_;
  auVar130._0_4_ = auVar23._0_4_ * fVar66;
  auVar130._4_4_ = auVar23._4_4_ * fVar95;
  auVar130._8_4_ = auVar23._8_4_ * fVar67;
  auVar130._12_4_ = auVar23._12_4_ * fVar145;
  auVar21 = vshufps_avx(auVar323,auVar323,0x55);
  auVar23 = vfmadd231ps_fma(auVar168,auVar21,auVar124);
  auVar124._8_8_ = 0;
  auVar124._0_8_ = *(ulong *)(prim + uVar59 * 7 + 6);
  auVar267 = vpmovsxwd_avx(auVar124);
  auVar146 = vfmadd231ps_fma(auVar146,auVar21,auVar20);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar59 * 0xb + 6);
  auVar24 = vpmovsxwd_avx(auVar16);
  auVar70 = vfmadd231ps_fma(auVar130,auVar21,auVar173);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar59 * 9 + 6);
  auVar108 = vpmovsxwd_avx(auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar59 * 0xd + 6);
  auVar71 = vpmovsxwd_avx(auVar21);
  auVar124 = vcvtdq2ps_avx(auVar19);
  auVar16 = vcvtdq2ps_avx(auVar22);
  auVar20 = vcvtdq2ps_avx(auVar170);
  auVar100._4_4_ = auVar99._0_4_;
  auVar100._0_4_ = auVar99._0_4_;
  auVar100._8_4_ = auVar99._0_4_;
  auVar100._12_4_ = auVar99._0_4_;
  auVar21 = vfmadd231ps_fma(auVar101,auVar100,auVar124);
  auVar22 = vfmadd231ps_fma(auVar102,auVar100,auVar16);
  auVar170 = vfmadd231ps_fma(auVar131,auVar20,auVar100);
  auVar173._8_8_ = 0;
  auVar173._0_8_ = *(ulong *)(prim + uVar59 * 0x12 + 6);
  auVar19 = vpmovsxwd_avx(auVar173);
  auVar324._4_4_ = auVar323._0_4_;
  auVar324._0_4_ = auVar323._0_4_;
  auVar324._8_4_ = auVar323._0_4_;
  auVar324._12_4_ = auVar323._0_4_;
  auVar102 = vfmadd231ps_fma(auVar23,auVar324,auVar124);
  auVar131 = vfmadd231ps_fma(auVar146,auVar324,auVar16);
  auVar69._8_4_ = 0x7fffffff;
  auVar69._0_8_ = 0x7fffffff7fffffff;
  auVar69._12_4_ = 0x7fffffff;
  auVar146 = vfmadd231ps_fma(auVar70,auVar324,auVar20);
  auVar124 = vandps_avx(auVar21,auVar69);
  auVar313._8_4_ = 0x219392ef;
  auVar313._0_8_ = 0x219392ef219392ef;
  auVar313._12_4_ = 0x219392ef;
  auVar124 = vcmpps_avx(auVar124,auVar313,1);
  auVar16 = vblendvps_avx(auVar21,auVar313,auVar124);
  auVar124 = vandps_avx(auVar22,auVar69);
  auVar124 = vcmpps_avx(auVar124,auVar313,1);
  auVar20 = vblendvps_avx(auVar22,auVar313,auVar124);
  auVar124 = vandps_avx(auVar170,auVar69);
  auVar124 = vcmpps_avx(auVar124,auVar313,1);
  auVar124 = vblendvps_avx(auVar170,auVar313,auVar124);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar59 * 0x16 + 6);
  auVar23 = vpmovsxwd_avx(auVar23);
  auVar314._4_4_ = fVar97;
  auVar314._0_4_ = fVar97;
  auVar314._8_4_ = fVar97;
  auVar314._12_4_ = fVar97;
  auVar21 = vcvtdq2ps_avx(auVar267);
  auVar173 = vcvtdq2ps_avx(auVar24);
  auVar173 = vsubps_avx(auVar173,auVar21);
  auVar101 = vfmadd213ps_fma(auVar173,auVar314,auVar21);
  auVar21 = vcvtdq2ps_avx(auVar108);
  auVar173 = vcvtdq2ps_avx(auVar71);
  auVar173 = vsubps_avx(auVar173,auVar21);
  auVar71 = vfmadd213ps_fma(auVar173,auVar314,auVar21);
  auVar21 = vcvtdq2ps_avx(auVar19);
  auVar173 = vcvtdq2ps_avx(auVar23);
  auVar173 = vsubps_avx(auVar173,auVar21);
  auVar23 = vfmadd213ps_fma(auVar173,auVar314,auVar21);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar59 * 0x14 + 6);
  auVar21 = vpmovsxwd_avx(auVar19);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar59 * 0x18 + 6);
  auVar173 = vpmovsxwd_avx(auVar22);
  auVar173 = vcvtdq2ps_avx(auVar173);
  auVar173 = vsubps_avx(auVar173,auVar21);
  auVar19 = vfmadd213ps_fma(auVar173,auVar314,auVar21);
  auVar170._8_8_ = 0;
  auVar170._0_8_ = *(ulong *)(prim + uVar59 * 0x1d + 6);
  auVar21 = vpmovsxwd_avx(auVar170);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar267._8_8_ = 0;
  auVar267._0_8_ = *(ulong *)(prim + uVar59 * 0x21 + 6);
  auVar173 = vpmovsxwd_avx(auVar267);
  auVar173 = vcvtdq2ps_avx(auVar173);
  auVar173 = vsubps_avx(auVar173,auVar21);
  auVar22 = vfmadd213ps_fma(auVar173,auVar314,auVar21);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar59 * 0x1f + 6);
  auVar21 = vpmovsxwd_avx(auVar24);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + uVar59 * 0x23 + 6);
  auVar173 = vpmovsxwd_avx(auVar108);
  auVar173 = vcvtdq2ps_avx(auVar173);
  auVar173 = vsubps_avx(auVar173,auVar21);
  auVar173 = vfmadd213ps_fma(auVar173,auVar314,auVar21);
  auVar21 = vrcpps_avx(auVar16);
  auVar70._8_4_ = 0x3f800000;
  auVar70._0_8_ = 0x3f8000003f800000;
  auVar70._12_4_ = 0x3f800000;
  auVar16 = vfnmadd213ps_fma(auVar16,auVar21,auVar70);
  auVar21 = vfmadd132ps_fma(auVar16,auVar21,auVar21);
  auVar16 = vrcpps_avx(auVar20);
  auVar20 = vfnmadd213ps_fma(auVar20,auVar16,auVar70);
  auVar20 = vfmadd132ps_fma(auVar20,auVar16,auVar16);
  auVar16 = vrcpps_avx(auVar124);
  auVar124 = vfnmadd213ps_fma(auVar124,auVar16,auVar70);
  auVar16 = vfmadd132ps_fma(auVar124,auVar16,auVar16);
  auVar124 = vsubps_avx(auVar101,auVar102);
  auVar186._0_4_ = auVar21._0_4_ * auVar124._0_4_;
  auVar186._4_4_ = auVar21._4_4_ * auVar124._4_4_;
  auVar186._8_4_ = auVar21._8_4_ * auVar124._8_4_;
  auVar186._12_4_ = auVar21._12_4_ * auVar124._12_4_;
  auVar124 = vsubps_avx(auVar71,auVar102);
  auVar169._0_4_ = auVar21._0_4_ * auVar124._0_4_;
  auVar169._4_4_ = auVar21._4_4_ * auVar124._4_4_;
  auVar169._8_4_ = auVar21._8_4_ * auVar124._8_4_;
  auVar169._12_4_ = auVar21._12_4_ * auVar124._12_4_;
  auVar124 = vsubps_avx(auVar23,auVar131);
  auVar101._0_4_ = auVar20._0_4_ * auVar124._0_4_;
  auVar101._4_4_ = auVar20._4_4_ * auVar124._4_4_;
  auVar101._8_4_ = auVar20._8_4_ * auVar124._8_4_;
  auVar101._12_4_ = auVar20._12_4_ * auVar124._12_4_;
  auVar124 = vsubps_avx(auVar19,auVar131);
  auVar147._0_4_ = auVar20._0_4_ * auVar124._0_4_;
  auVar147._4_4_ = auVar20._4_4_ * auVar124._4_4_;
  auVar147._8_4_ = auVar20._8_4_ * auVar124._8_4_;
  auVar147._12_4_ = auVar20._12_4_ * auVar124._12_4_;
  auVar124 = vsubps_avx(auVar22,auVar146);
  auVar220._0_4_ = auVar16._0_4_ * auVar124._0_4_;
  auVar220._4_4_ = auVar16._4_4_ * auVar124._4_4_;
  auVar220._8_4_ = auVar16._8_4_ * auVar124._8_4_;
  auVar220._12_4_ = auVar16._12_4_ * auVar124._12_4_;
  auVar124 = vsubps_avx(auVar173,auVar146);
  auVar131._0_4_ = auVar16._0_4_ * auVar124._0_4_;
  auVar131._4_4_ = auVar16._4_4_ * auVar124._4_4_;
  auVar131._8_4_ = auVar16._8_4_ * auVar124._8_4_;
  auVar131._12_4_ = auVar16._12_4_ * auVar124._12_4_;
  auVar124 = vpminsd_avx(auVar186,auVar169);
  auVar16 = vpminsd_avx(auVar101,auVar147);
  auVar124 = vmaxps_avx(auVar124,auVar16);
  auVar16 = vpminsd_avx(auVar220,auVar131);
  uVar68 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar252._4_4_ = uVar68;
  auVar252._0_4_ = uVar68;
  auVar252._8_4_ = uVar68;
  auVar252._12_4_ = uVar68;
  auVar16 = vmaxps_avx(auVar16,auVar252);
  auVar124 = vmaxps_avx(auVar124,auVar16);
  auVar202._0_4_ = auVar124._0_4_ * 0.99999964;
  auVar202._4_4_ = auVar124._4_4_ * 0.99999964;
  auVar202._8_4_ = auVar124._8_4_ * 0.99999964;
  auVar202._12_4_ = auVar124._12_4_ * 0.99999964;
  auVar124 = vpmaxsd_avx(auVar186,auVar169);
  auVar16 = vpmaxsd_avx(auVar101,auVar147);
  auVar124 = vminps_avx(auVar124,auVar16);
  auVar16 = vpmaxsd_avx(auVar220,auVar131);
  uVar68 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar148._4_4_ = uVar68;
  auVar148._0_4_ = uVar68;
  auVar148._8_4_ = uVar68;
  auVar148._12_4_ = uVar68;
  auVar16 = vminps_avx(auVar16,auVar148);
  auVar124 = vminps_avx(auVar124,auVar16);
  local_648._1_3_ = 0;
  auVar71[4] = local_648[0];
  auVar71._0_4_ = local_648._0_4_;
  auVar71._5_3_ = 0;
  auVar71[8] = local_648[0];
  auVar71._9_3_ = 0;
  auVar71[0xc] = local_648[0];
  auVar71._13_3_ = 0;
  auVar16 = vpcmpgtd_avx(auVar71,_DAT_01f4ad30);
  auVar102._0_4_ = auVar124._0_4_ * 1.0000004;
  auVar102._4_4_ = auVar124._4_4_ * 1.0000004;
  auVar102._8_4_ = auVar124._8_4_ * 1.0000004;
  auVar102._12_4_ = auVar124._12_4_ * 1.0000004;
  auVar124 = vcmpps_avx(auVar202,auVar102,2);
  auVar124 = vandps_avx(auVar124,auVar16);
  uVar65 = vmovmskps_avx(auVar124);
  auVar92._16_16_ = mm_lookupmask_ps._240_16_;
  auVar92._0_16_ = mm_lookupmask_ps._240_16_;
  local_1b8 = vblendps_avx(auVar92,ZEXT832(0) << 0x20,0x80);
  local_458 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_450 = prim;
LAB_012399d3:
  uVar59 = (ulong)uVar65;
  if (uVar59 == 0) {
    return;
  }
  lVar62 = 0;
  for (; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
    lVar62 = lVar62 + 1;
  }
  uVar58 = *(uint *)(local_450 + 2);
  uVar8 = *(uint *)(local_450 + lVar62 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[uVar58].ptr;
  fVar66 = (pGVar9->time_range).lower;
  fVar95 = pGVar9->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0x70) - fVar66) / ((pGVar9->time_range).upper - fVar66));
  auVar124 = vroundss_avx(ZEXT416((uint)fVar95),ZEXT416((uint)fVar95),9);
  auVar124 = vminss_avx(auVar124,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar267 = vmaxss_avx(ZEXT816(0),auVar124);
  uVar59 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           (ulong)uVar8 *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar64 = (long)(int)auVar267._0_4_ * 0x38;
  lVar11 = *(long *)(_Var10 + lVar64);
  lVar12 = *(long *)(_Var10 + 0x10 + lVar64);
  auVar124 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar59);
  lVar62 = uVar59 + 1;
  auVar16 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar62);
  lVar1 = uVar59 + 2;
  auVar20 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  lVar2 = uVar59 + 3;
  pauVar3 = (undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  auVar201 = *pauVar3;
  lVar11 = *(long *)&pGVar9[4].fnumTimeSegments;
  lVar12 = *(long *)(lVar11 + lVar64);
  lVar13 = *(long *)(lVar11 + 0x10 + lVar64);
  auVar21 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar59);
  auVar173 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar62);
  auVar23 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
  pfVar4 = (float *)(lVar12 + lVar13 * lVar2);
  fVar66 = *pfVar4;
  fVar97 = pfVar4[1];
  fVar67 = pfVar4[2];
  fVar145 = pfVar4[3];
  auVar100 = ZEXT816(0) << 0x40;
  auVar265._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar265._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar265._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar265._12_4_ = *(float *)(*pauVar3 + 0xc) * 0.0;
  auVar149._8_4_ = 0x3e2aaaab;
  auVar149._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar149._12_4_ = 0x3e2aaaab;
  auVar71 = vfmadd213ps_fma(auVar149,auVar20,auVar265);
  auVar299._8_4_ = 0x3f000000;
  auVar299._0_8_ = 0x3f0000003f000000;
  auVar299._12_4_ = 0x3f000000;
  auVar19 = vfmadd231ps_fma(auVar265,auVar20,auVar299);
  auVar19 = vfnmadd231ps_fma(auVar19,auVar16,auVar100);
  auVar148 = vfnmadd231ps_fma(auVar19,auVar124,auVar299);
  auVar187._0_4_ = fVar66 * 0.0;
  auVar187._4_4_ = fVar97 * 0.0;
  auVar187._8_4_ = fVar67 * 0.0;
  auVar187._12_4_ = fVar145 * 0.0;
  auVar19 = vfmadd213ps_fma(auVar149,auVar23,auVar187);
  auVar150._8_4_ = 0x3f2aaaab;
  auVar150._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar150._12_4_ = 0x3f2aaaab;
  auVar19 = vfmadd231ps_fma(auVar19,auVar173,auVar150);
  auVar19 = vfmadd231ps_fma(auVar19,auVar21,auVar149);
  auVar22 = vfmadd231ps_fma(auVar187,auVar23,auVar299);
  auVar22 = vfnmadd231ps_fma(auVar22,auVar173,auVar100);
  auVar170 = vfnmadd231ps_fma(auVar22,auVar21,auVar299);
  auVar285._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar285._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar285._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar285._12_4_ = *(float *)(*pauVar3 + 0xc) * 0.5;
  auVar22 = vfmadd231ps_fma(auVar285,auVar100,auVar20);
  auVar22 = vfnmadd231ps_fma(auVar22,auVar299,auVar16);
  auVar168 = vfnmadd231ps_fma(auVar22,auVar100,auVar124);
  auVar253._0_4_ = fVar66 * 0.16666667;
  auVar253._4_4_ = fVar97 * 0.16666667;
  auVar253._8_4_ = fVar67 * 0.16666667;
  auVar253._12_4_ = fVar145 * 0.16666667;
  auVar22 = vfmadd231ps_fma(auVar253,auVar23,auVar150);
  auVar22 = vfmadd231ps_fma(auVar22,auVar173,auVar149);
  auVar22 = vfmadd231ps_fma(auVar22,auVar21,auVar100);
  auVar203._0_4_ = fVar66 * 0.5;
  auVar203._4_4_ = fVar97 * 0.5;
  auVar203._8_4_ = fVar67 * 0.5;
  auVar203._12_4_ = fVar145 * 0.5;
  auVar23 = vfmadd231ps_fma(auVar203,auVar100,auVar23);
  auVar173 = vfnmadd231ps_fma(auVar23,auVar299,auVar173);
  auVar23 = vfnmadd231ps_fma(auVar173,auVar100,auVar21);
  auVar21 = vshufps_avx(auVar148,auVar148,0xc9);
  auVar173 = vshufps_avx(auVar19,auVar19,0xc9);
  fVar241 = auVar148._0_4_;
  auVar103._0_4_ = fVar241 * auVar173._0_4_;
  fVar242 = auVar148._4_4_;
  auVar103._4_4_ = fVar242 * auVar173._4_4_;
  fVar243 = auVar148._8_4_;
  auVar103._8_4_ = fVar243 * auVar173._8_4_;
  fVar96 = auVar148._12_4_;
  auVar103._12_4_ = fVar96 * auVar173._12_4_;
  auVar102 = vfmsub231ps_fma(auVar103,auVar21,auVar19);
  auVar173 = vshufps_avx(auVar170,auVar170,0xc9);
  auVar104._0_4_ = fVar241 * auVar173._0_4_;
  auVar104._4_4_ = fVar242 * auVar173._4_4_;
  auVar104._8_4_ = fVar243 * auVar173._8_4_;
  auVar104._12_4_ = fVar96 * auVar173._12_4_;
  auVar131 = vfmsub231ps_fma(auVar104,auVar21,auVar170);
  auVar21 = vshufps_avx(auVar168,auVar168,0xc9);
  auVar173 = vshufps_avx(auVar22,auVar22,0xc9);
  fVar284 = auVar168._0_4_;
  auVar105._0_4_ = fVar284 * auVar173._0_4_;
  fVar296 = auVar168._4_4_;
  auVar105._4_4_ = fVar296 * auVar173._4_4_;
  fVar297 = auVar168._8_4_;
  auVar105._8_4_ = fVar297 * auVar173._8_4_;
  fVar298 = auVar168._12_4_;
  auVar105._12_4_ = fVar298 * auVar173._12_4_;
  auVar146 = vfmsub231ps_fma(auVar105,auVar21,auVar22);
  auVar173 = vshufps_avx(auVar23,auVar23,0xc9);
  auVar106._0_4_ = fVar284 * auVar173._0_4_;
  auVar106._4_4_ = fVar296 * auVar173._4_4_;
  auVar106._8_4_ = fVar297 * auVar173._8_4_;
  auVar106._12_4_ = fVar298 * auVar173._12_4_;
  auVar70 = vfmsub231ps_fma(auVar106,auVar21,auVar23);
  lVar12 = *(long *)(_Var10 + 0x38 + lVar64);
  lVar13 = *(long *)(_Var10 + 0x48 + lVar64);
  auVar21 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
  pauVar5 = (undefined1 (*) [12])(lVar12 + lVar13 * lVar2);
  auVar56 = *pauVar5;
  fVar144 = *(float *)pauVar5[1];
  lVar14 = *(long *)(lVar11 + 0x38 + lVar64);
  lVar11 = *(long *)(lVar11 + 0x48 + lVar64);
  auVar254._0_4_ = *(float *)*pauVar5 * 0.0;
  auVar254._4_4_ = *(float *)(*pauVar5 + 4) * 0.0;
  auVar254._8_4_ = *(float *)(*pauVar5 + 8) * 0.0;
  auVar254._12_4_ = fVar144 * 0.0;
  auVar101 = vfmadd213ps_fma(auVar149,auVar21,auVar254);
  auVar23 = vfmadd231ps_fma(auVar254,auVar21,auVar299);
  auVar173 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar62);
  auVar19 = vfnmadd231ps_fma(auVar23,auVar173,auVar100);
  auVar23 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar59);
  auVar169 = vfnmadd231ps_fma(auVar19,auVar23,auVar299);
  auVar19 = *(undefined1 (*) [16])(lVar14 + lVar1 * lVar11);
  pfVar4 = (float *)(lVar14 + lVar11 * lVar2);
  fVar66 = *pfVar4;
  fVar97 = pfVar4[1];
  fVar67 = pfVar4[2];
  fVar145 = pfVar4[3];
  auVar72._0_4_ = fVar66 * 0.0;
  auVar72._4_4_ = fVar97 * 0.0;
  auVar72._8_4_ = fVar67 * 0.0;
  auVar72._12_4_ = fVar145 * 0.0;
  auVar170 = vfmadd213ps_fma(auVar149,auVar19,auVar72);
  auVar22 = *(undefined1 (*) [16])(lVar14 + lVar62 * lVar11);
  auVar107._8_4_ = 0x3f2aaaab;
  auVar107._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar107._12_4_ = 0x3f2aaaab;
  auVar24 = vfmadd231ps_fma(auVar170,auVar22,auVar107);
  auVar170 = *(undefined1 (*) [16])(lVar14 + uVar59 * lVar11);
  auVar108 = vfmadd231ps_fma(auVar24,auVar170,auVar149);
  auVar24 = vshufps_avx(auVar108,auVar108,0xc9);
  fVar235 = auVar169._0_4_;
  auVar221._0_4_ = fVar235 * auVar24._0_4_;
  fVar236 = auVar169._4_4_;
  auVar221._4_4_ = fVar236 * auVar24._4_4_;
  fVar238 = auVar169._8_4_;
  auVar221._8_4_ = fVar238 * auVar24._8_4_;
  fVar240 = auVar169._12_4_;
  auVar221._12_4_ = fVar240 * auVar24._12_4_;
  auVar24 = vshufps_avx(auVar169,auVar169,0xc9);
  auVar99 = vfmsub231ps_fma(auVar221,auVar24,auVar108);
  auVar108 = vfmadd231ps_fma(auVar72,auVar19,auVar299);
  auVar108 = vfnmadd231ps_fma(auVar108,auVar22,auVar100);
  auVar100 = vfnmadd231ps_fma(auVar108,auVar170,auVar299);
  auVar108 = vshufps_avx(auVar100,auVar100,0xc9);
  auVar222._0_4_ = fVar235 * auVar108._0_4_;
  auVar222._4_4_ = fVar236 * auVar108._4_4_;
  auVar222._8_4_ = fVar238 * auVar108._8_4_;
  auVar222._12_4_ = fVar240 * auVar108._12_4_;
  auVar100 = vfmsub231ps_fma(auVar222,auVar24,auVar100);
  auVar73._0_4_ = fVar66 * 0.16666667;
  auVar73._4_4_ = fVar97 * 0.16666667;
  auVar73._8_4_ = fVar67 * 0.16666667;
  auVar73._12_4_ = fVar145 * 0.16666667;
  auVar325._8_4_ = 0x3f2aaaab;
  auVar325._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar325._12_4_ = 0x3f2aaaab;
  auVar24 = vfmadd231ps_fma(auVar73,auVar19,auVar325);
  auVar151._0_4_ = fVar66 * 0.5;
  auVar151._4_4_ = fVar97 * 0.5;
  auVar151._8_4_ = fVar67 * 0.5;
  auVar151._12_4_ = fVar145 * 0.5;
  auVar108 = ZEXT816(0) << 0x20;
  auVar19 = vfmadd231ps_fma(auVar151,auVar108,auVar19);
  auVar24 = vfmadd231ps_fma(auVar24,auVar22,auVar149);
  auVar19 = vfnmadd231ps_fma(auVar19,auVar299,auVar22);
  auVar22 = vfmadd231ps_fma(auVar24,auVar170,auVar108);
  auVar170 = vfnmadd231ps_fma(auVar19,auVar108,auVar170);
  local_658 = auVar56._0_4_;
  fStack_654 = auVar56._4_4_;
  fStack_650 = auVar56._8_4_;
  auVar188._0_4_ = local_658 * 0.5;
  auVar188._4_4_ = fStack_654 * 0.5;
  auVar188._8_4_ = fStack_650 * 0.5;
  auVar188._12_4_ = fVar144 * 0.5;
  auVar19 = vfmadd231ps_fma(auVar188,auVar108,auVar21);
  auVar19 = vfnmadd231ps_fma(auVar19,auVar299,auVar173);
  auVar186 = vfnmadd231ps_fma(auVar19,auVar108,auVar23);
  auVar19 = vshufps_avx(auVar22,auVar22,0xc9);
  fVar167 = auVar186._0_4_;
  auVar109._0_4_ = fVar167 * auVar19._0_4_;
  fVar184 = auVar186._4_4_;
  auVar109._4_4_ = fVar184 * auVar19._4_4_;
  fVar185 = auVar186._8_4_;
  auVar109._8_4_ = fVar185 * auVar19._8_4_;
  fVar200 = auVar186._12_4_;
  auVar109._12_4_ = fVar200 * auVar19._12_4_;
  auVar19 = vshufps_avx(auVar186,auVar186,0xc9);
  auVar130 = vfmsub231ps_fma(auVar109,auVar19,auVar22);
  auVar22 = vshufps_avx(auVar170,auVar170,0xc9);
  auVar280._0_4_ = fVar167 * auVar22._0_4_;
  auVar280._4_4_ = fVar184 * auVar22._4_4_;
  auVar280._8_4_ = fVar185 * auVar22._8_4_;
  auVar280._12_4_ = fVar200 * auVar22._12_4_;
  auVar147 = vfmsub231ps_fma(auVar280,auVar19,auVar170);
  fVar95 = fVar95 - auVar267._0_4_;
  local_568._0_4_ = auVar201._0_4_;
  local_568._4_4_ = auVar201._4_4_;
  uStack_560._0_4_ = auVar201._8_4_;
  uStack_560._4_4_ = auVar201._12_4_;
  auVar110._0_4_ = (float)local_568._0_4_ * 0.16666667;
  auVar110._4_4_ = (float)local_568._4_4_ * 0.16666667;
  auVar110._8_4_ = (float)uStack_560 * 0.16666667;
  auVar110._12_4_ = uStack_560._4_4_ * 0.16666667;
  auVar19 = vfmadd231ps_fma(auVar110,auVar325,auVar20);
  auVar170 = vfmadd231ps_fma(auVar71,auVar16,auVar325);
  auVar22 = vpermilps_avx(auVar102,0xc9);
  auVar20 = vdpps_avx(auVar22,auVar22,0x7f);
  auVar16 = vfmadd231ps_fma(auVar19,auVar16,auVar149);
  auVar267 = vfmadd231ps_fma(auVar170,auVar124,auVar149);
  auVar18._12_4_ = 0;
  auVar18._0_12_ = ZEXT812(0);
  auVar24 = vfmadd231ps_fma(auVar16,auVar124,auVar18 << 0x20);
  fVar97 = auVar20._0_4_;
  auVar170 = ZEXT416((uint)fVar97);
  auVar124 = vrsqrtss_avx(auVar170,auVar170);
  fVar66 = auVar124._0_4_;
  fVar66 = fVar97 * -0.5 * fVar66 * fVar66 * fVar66 + fVar66 * 1.5;
  auVar16 = vpermilps_avx(auVar131,0xc9);
  auVar124 = vdpps_avx(auVar22,auVar16,0x7f);
  auVar300._0_4_ = fVar97 * auVar16._0_4_;
  auVar300._4_4_ = fVar97 * auVar16._4_4_;
  auVar300._8_4_ = fVar97 * auVar16._8_4_;
  auVar300._12_4_ = fVar97 * auVar16._12_4_;
  fVar97 = auVar124._0_4_;
  auVar315._0_4_ = fVar97 * auVar22._0_4_;
  auVar315._4_4_ = fVar97 * auVar22._4_4_;
  auVar315._8_4_ = fVar97 * auVar22._8_4_;
  auVar315._12_4_ = fVar97 * auVar22._12_4_;
  auVar19 = vsubps_avx(auVar300,auVar315);
  auVar124 = vrcpss_avx(auVar170,auVar170);
  auVar16 = vfnmadd213ss_fma(auVar20,auVar124,SUB6416(ZEXT464(0x40000000),0));
  fVar67 = auVar124._0_4_ * auVar16._0_4_;
  auVar170 = vpermilps_avx(auVar146,0xc9);
  auVar16 = vdpps_avx(auVar170,auVar170,0x7f);
  fVar218 = auVar22._0_4_ * fVar66;
  fVar234 = auVar22._4_4_ * fVar66;
  fVar237 = auVar22._8_4_ * fVar66;
  fVar239 = auVar22._12_4_ * fVar66;
  auVar22 = vpermilps_avx(auVar70,0xc9);
  auVar124 = vblendps_avx(auVar16,_DAT_01f45a50,0xe);
  auVar20 = vrsqrtss_avx(auVar124,auVar124);
  fVar145 = auVar16._0_4_;
  fVar97 = auVar20._0_4_;
  auVar20 = vdpps_avx(auVar170,auVar22,0x7f);
  fVar97 = fVar97 * 1.5 + fVar97 * fVar145 * -0.5 * fVar97 * fVar97;
  auVar152._0_4_ = fVar145 * auVar22._0_4_;
  auVar152._4_4_ = fVar145 * auVar22._4_4_;
  auVar152._8_4_ = fVar145 * auVar22._8_4_;
  auVar152._12_4_ = fVar145 * auVar22._12_4_;
  fVar145 = auVar20._0_4_;
  auVar132._0_4_ = fVar145 * auVar170._0_4_;
  auVar132._4_4_ = fVar145 * auVar170._4_4_;
  auVar132._8_4_ = fVar145 * auVar170._8_4_;
  auVar132._12_4_ = fVar145 * auVar170._12_4_;
  auVar20 = vsubps_avx(auVar152,auVar132);
  auVar124 = vrcpss_avx(auVar124,auVar124);
  auVar16 = vfnmadd213ss_fma(auVar16,auVar124,SUB6416(ZEXT464(0x40000000),0));
  fVar145 = auVar16._0_4_ * auVar124._0_4_;
  fVar143 = auVar170._0_4_ * fVar97;
  fVar164 = auVar170._4_4_ * fVar97;
  fVar165 = auVar170._8_4_ * fVar97;
  fVar166 = auVar170._12_4_ * fVar97;
  auVar124 = vshufps_avx(auVar148,auVar148,0xff);
  auVar16 = vshufps_avx(auVar267,auVar267,0xff);
  auVar204._0_4_ = auVar16._0_4_ * fVar218;
  auVar204._4_4_ = auVar16._4_4_ * fVar234;
  auVar204._8_4_ = auVar16._8_4_ * fVar237;
  auVar204._12_4_ = auVar16._12_4_ * fVar239;
  auVar171._0_4_ = auVar124._0_4_ * fVar218 + fVar66 * auVar19._0_4_ * fVar67 * auVar16._0_4_;
  auVar171._4_4_ = auVar124._4_4_ * fVar234 + fVar66 * auVar19._4_4_ * fVar67 * auVar16._4_4_;
  auVar171._8_4_ = auVar124._8_4_ * fVar237 + fVar66 * auVar19._8_4_ * fVar67 * auVar16._8_4_;
  auVar171._12_4_ = auVar124._12_4_ * fVar239 + fVar66 * auVar19._12_4_ * fVar67 * auVar16._12_4_;
  auVar19 = vsubps_avx(auVar267,auVar204);
  local_648._0_4_ = auVar267._0_4_ + auVar204._0_4_;
  local_648._4_4_ = auVar267._4_4_ + auVar204._4_4_;
  uStack_640._0_4_ = auVar267._8_4_ + auVar204._8_4_;
  uStack_640._4_4_ = auVar267._12_4_ + auVar204._12_4_;
  auVar22 = vsubps_avx(auVar148,auVar171);
  auVar124 = vshufps_avx(auVar168,auVar168,0xff);
  auVar16 = vshufps_avx(auVar24,auVar24,0xff);
  auVar153._0_4_ = auVar16._0_4_ * fVar143;
  auVar153._4_4_ = auVar16._4_4_ * fVar164;
  auVar153._8_4_ = auVar16._8_4_ * fVar165;
  auVar153._12_4_ = auVar16._12_4_ * fVar166;
  auVar172._0_4_ = auVar124._0_4_ * fVar143 + auVar16._0_4_ * fVar97 * auVar20._0_4_ * fVar145;
  auVar172._4_4_ = auVar124._4_4_ * fVar164 + auVar16._4_4_ * fVar97 * auVar20._4_4_ * fVar145;
  auVar172._8_4_ = auVar124._8_4_ * fVar165 + auVar16._8_4_ * fVar97 * auVar20._8_4_ * fVar145;
  auVar172._12_4_ = auVar124._12_4_ * fVar166 + auVar16._12_4_ * fVar97 * auVar20._12_4_ * fVar145;
  auVar20 = vsubps_avx(auVar24,auVar153);
  local_568._4_4_ = auVar24._4_4_ + auVar153._4_4_;
  local_568._0_4_ = auVar24._0_4_ + auVar153._0_4_;
  uStack_560._0_4_ = auVar24._8_4_ + auVar153._8_4_;
  uStack_560._4_4_ = auVar24._12_4_ + auVar153._12_4_;
  auVar170 = vsubps_avx(auVar168,auVar172);
  auVar133._8_4_ = 0x3e2aaaab;
  auVar133._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar133._12_4_ = 0x3e2aaaab;
  auVar301._0_4_ = local_658 * 0.16666667;
  auVar301._4_4_ = fStack_654 * 0.16666667;
  auVar301._8_4_ = fStack_650 * 0.16666667;
  auVar301._12_4_ = fVar144 * 0.16666667;
  auVar111._8_4_ = 0x3f2aaaab;
  auVar111._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar111._12_4_ = 0x3f2aaaab;
  auVar16 = vfmadd231ps_fma(auVar301,auVar111,auVar21);
  auVar21 = vfmadd231ps_fma(auVar101,auVar173,auVar111);
  auVar267 = vpermilps_avx(auVar99,0xc9);
  auVar124 = vdpps_avx(auVar267,auVar267,0x7f);
  auVar16 = vfmadd231ps_fma(auVar16,auVar173,auVar133);
  auVar24 = vfmadd231ps_fma(auVar21,auVar23,auVar133);
  auVar288._12_4_ = 0;
  auVar288._0_12_ = ZEXT812(0);
  auVar108 = vfmadd231ps_fma(auVar16,auVar23,auVar288 << 0x20);
  fVar97 = auVar124._0_4_;
  auVar173 = ZEXT416((uint)fVar97);
  auVar16 = vrsqrtss_avx(auVar173,auVar173);
  fVar66 = auVar16._0_4_;
  fVar66 = fVar66 * 1.5 + fVar66 * fVar66 * fVar97 * -0.5 * fVar66;
  auVar21 = vpermilps_avx(auVar100,0xc9);
  auVar16 = vdpps_avx(auVar267,auVar21,0x7f);
  auVar223._0_4_ = fVar97 * auVar21._0_4_;
  auVar223._4_4_ = fVar97 * auVar21._4_4_;
  auVar223._8_4_ = fVar97 * auVar21._8_4_;
  auVar223._12_4_ = fVar97 * auVar21._12_4_;
  fVar97 = auVar16._0_4_;
  auVar266._0_4_ = fVar97 * auVar267._0_4_;
  auVar266._4_4_ = fVar97 * auVar267._4_4_;
  auVar266._8_4_ = fVar97 * auVar267._8_4_;
  auVar266._12_4_ = fVar97 * auVar267._12_4_;
  auVar21 = vsubps_avx(auVar223,auVar266);
  auVar16 = vrcpss_avx(auVar173,auVar173);
  auVar124 = vfnmadd213ss_fma(auVar124,auVar16,SUB6416(ZEXT464(0x40000000),0));
  fVar67 = auVar16._0_4_ * auVar124._0_4_;
  auVar23 = vpermilps_avx(auVar130,0xc9);
  auVar124 = vdpps_avx(auVar23,auVar23,0x7f);
  fVar144 = auVar267._0_4_ * fVar66;
  fVar143 = auVar267._4_4_ * fVar66;
  fVar164 = auVar267._8_4_ * fVar66;
  fVar165 = auVar267._12_4_ * fVar66;
  auVar173 = vpermilps_avx(auVar147,0xc9);
  fVar145 = auVar124._0_4_;
  auVar267 = ZEXT416((uint)fVar145);
  auVar16 = vrsqrtss_avx(auVar267,auVar267);
  fVar97 = auVar16._0_4_;
  auVar16 = vdpps_avx(auVar23,auVar173,0x7f);
  fVar97 = fVar97 * 1.5 + fVar145 * -0.5 * fVar97 * fVar97 * fVar97;
  auVar174._0_4_ = fVar145 * auVar173._0_4_;
  auVar174._4_4_ = fVar145 * auVar173._4_4_;
  auVar174._8_4_ = fVar145 * auVar173._8_4_;
  auVar174._12_4_ = fVar145 * auVar173._12_4_;
  fVar145 = auVar16._0_4_;
  auVar286._0_4_ = fVar145 * auVar23._0_4_;
  auVar286._4_4_ = fVar145 * auVar23._4_4_;
  auVar286._8_4_ = fVar145 * auVar23._8_4_;
  auVar286._12_4_ = fVar145 * auVar23._12_4_;
  auVar173 = vsubps_avx(auVar174,auVar286);
  auVar16 = vrcpss_avx(auVar267,auVar267);
  auVar124 = vfnmadd213ss_fma(auVar124,auVar16,ZEXT416(0x40000000));
  fVar145 = auVar16._0_4_ * auVar124._0_4_;
  fVar166 = auVar23._0_4_ * fVar97;
  fVar218 = auVar23._4_4_ * fVar97;
  fVar234 = auVar23._8_4_ * fVar97;
  fVar237 = auVar23._12_4_ * fVar97;
  auVar124 = vshufps_avx(auVar169,auVar169,0xff);
  auVar16 = vshufps_avx(auVar24,auVar24,0xff);
  auVar154._0_4_ = auVar16._0_4_ * fVar144;
  auVar154._4_4_ = auVar16._4_4_ * fVar143;
  auVar154._8_4_ = auVar16._8_4_ * fVar164;
  auVar154._12_4_ = auVar16._12_4_ * fVar165;
  auVar112._0_4_ = auVar124._0_4_ * fVar144 + auVar16._0_4_ * fVar66 * fVar67 * auVar21._0_4_;
  auVar112._4_4_ = auVar124._4_4_ * fVar143 + auVar16._4_4_ * fVar66 * fVar67 * auVar21._4_4_;
  auVar112._8_4_ = auVar124._8_4_ * fVar164 + auVar16._8_4_ * fVar66 * fVar67 * auVar21._8_4_;
  auVar112._12_4_ = auVar124._12_4_ * fVar165 + auVar16._12_4_ * fVar66 * fVar67 * auVar21._12_4_;
  auVar21 = vsubps_avx(auVar24,auVar154);
  fVar67 = auVar24._0_4_ + auVar154._0_4_;
  fVar144 = auVar24._4_4_ + auVar154._4_4_;
  fVar143 = auVar24._8_4_ + auVar154._8_4_;
  fVar164 = auVar24._12_4_ + auVar154._12_4_;
  auVar23 = vsubps_avx(auVar169,auVar112);
  auVar124 = vshufps_avx(auVar186,auVar186,0xff);
  auVar16 = vshufps_avx(auVar108,auVar108,0xff);
  auVar287._0_4_ = auVar16._0_4_ * fVar166;
  auVar287._4_4_ = auVar16._4_4_ * fVar218;
  auVar287._8_4_ = auVar16._8_4_ * fVar234;
  auVar287._12_4_ = auVar16._12_4_ * fVar237;
  auVar113._0_4_ = auVar124._0_4_ * fVar166 + auVar16._0_4_ * fVar97 * auVar173._0_4_ * fVar145;
  auVar113._4_4_ = auVar124._4_4_ * fVar218 + auVar16._4_4_ * fVar97 * auVar173._4_4_ * fVar145;
  auVar113._8_4_ = auVar124._8_4_ * fVar234 + auVar16._8_4_ * fVar97 * auVar173._8_4_ * fVar145;
  auVar113._12_4_ = auVar124._12_4_ * fVar237 + auVar16._12_4_ * fVar97 * auVar173._12_4_ * fVar145;
  auVar124 = vsubps_avx(auVar108,auVar287);
  local_618._0_4_ = auVar108._0_4_ + auVar287._0_4_;
  local_618._4_4_ = auVar108._4_4_ + auVar287._4_4_;
  fStack_610 = auVar108._8_4_ + auVar287._8_4_;
  fStack_60c = auVar108._12_4_ + auVar287._12_4_;
  auVar16 = vsubps_avx(auVar186,auVar113);
  local_4f8._0_4_ = auVar22._0_4_;
  local_4f8._4_4_ = auVar22._4_4_;
  fStack_4f0 = auVar22._8_4_;
  fStack_4ec = auVar22._12_4_;
  auVar189._0_4_ = auVar19._0_4_ + (float)local_4f8._0_4_ * 0.33333334;
  auVar189._4_4_ = auVar19._4_4_ + (float)local_4f8._4_4_ * 0.33333334;
  auVar189._8_4_ = auVar19._8_4_ + fStack_4f0 * 0.33333334;
  auVar189._12_4_ = auVar19._12_4_ + fStack_4ec * 0.33333334;
  fVar66 = 1.0 - fVar95;
  auVar114._4_4_ = fVar66;
  auVar114._0_4_ = fVar66;
  auVar114._8_4_ = fVar66;
  auVar114._12_4_ = fVar66;
  auVar74._0_4_ = fVar95 * auVar21._0_4_;
  auVar74._4_4_ = fVar95 * auVar21._4_4_;
  auVar74._8_4_ = fVar95 * auVar21._8_4_;
  auVar74._12_4_ = fVar95 * auVar21._12_4_;
  auVar130 = vfmadd231ps_fma(auVar74,auVar114,auVar19);
  auVar75._0_4_ = fVar95 * (auVar21._0_4_ + auVar23._0_4_ * 0.33333334);
  auVar75._4_4_ = fVar95 * (auVar21._4_4_ + auVar23._4_4_ * 0.33333334);
  auVar75._8_4_ = fVar95 * (auVar21._8_4_ + auVar23._8_4_ * 0.33333334);
  auVar75._12_4_ = fVar95 * (auVar21._12_4_ + auVar23._12_4_ * 0.33333334);
  auVar147 = vfmadd231ps_fma(auVar75,auVar114,auVar189);
  local_538 = auVar170._0_4_;
  fStack_534 = auVar170._4_4_;
  fStack_530 = auVar170._8_4_;
  fStack_52c = auVar170._12_4_;
  auVar134._0_4_ = local_538 * 0.33333334;
  auVar134._4_4_ = fStack_534 * 0.33333334;
  auVar134._8_4_ = fStack_530 * 0.33333334;
  auVar134._12_4_ = fStack_52c * 0.33333334;
  auVar21 = vsubps_avx(auVar20,auVar134);
  auVar302._0_4_ = (float)local_648._0_4_ + (fVar241 + auVar171._0_4_) * 0.33333334;
  auVar302._4_4_ = (float)local_648._4_4_ + (fVar242 + auVar171._4_4_) * 0.33333334;
  auVar302._8_4_ = (float)uStack_640 + (fVar243 + auVar171._8_4_) * 0.33333334;
  auVar302._12_4_ = uStack_640._4_4_ + (fVar96 + auVar171._12_4_) * 0.33333334;
  auVar245._0_4_ = (fVar284 + auVar172._0_4_) * 0.33333334;
  auVar245._4_4_ = (fVar296 + auVar172._4_4_) * 0.33333334;
  auVar245._8_4_ = (fVar297 + auVar172._8_4_) * 0.33333334;
  auVar245._12_4_ = (fVar298 + auVar172._12_4_) * 0.33333334;
  auVar173 = vsubps_avx(_local_568,auVar245);
  auVar279._0_4_ = auVar16._0_4_ * 0.33333334;
  auVar279._4_4_ = auVar16._4_4_ * 0.33333334;
  auVar279._8_4_ = auVar16._8_4_ * 0.33333334;
  auVar279._12_4_ = auVar16._12_4_ * 0.33333334;
  auVar16 = vsubps_avx(auVar124,auVar279);
  auVar255._0_4_ = (fVar167 + auVar113._0_4_) * 0.33333334;
  auVar255._4_4_ = (fVar184 + auVar113._4_4_) * 0.33333334;
  auVar255._8_4_ = (fVar185 + auVar113._8_4_) * 0.33333334;
  auVar255._12_4_ = (fVar200 + auVar113._12_4_) * 0.33333334;
  auVar23 = vsubps_avx(_local_618,auVar255);
  auVar157._0_4_ = fVar95 * auVar16._0_4_;
  auVar157._4_4_ = fVar95 * auVar16._4_4_;
  auVar157._8_4_ = fVar95 * auVar16._8_4_;
  auVar157._12_4_ = fVar95 * auVar16._12_4_;
  auVar224._0_4_ = fVar95 * auVar124._0_4_;
  auVar224._4_4_ = fVar95 * auVar124._4_4_;
  auVar224._8_4_ = fVar95 * auVar124._8_4_;
  auVar224._12_4_ = fVar95 * auVar124._12_4_;
  auVar148 = vfmadd231ps_fma(auVar157,auVar114,auVar21);
  auVar168 = vfmadd231ps_fma(auVar224,auVar114,auVar20);
  auVar76._0_4_ = fVar95 * fVar67;
  auVar76._4_4_ = fVar95 * fVar144;
  auVar76._8_4_ = fVar95 * fVar143;
  auVar76._12_4_ = fVar95 * fVar164;
  auVar135._0_4_ = fVar95 * (fVar67 + (fVar235 + auVar112._0_4_) * 0.33333334);
  auVar135._4_4_ = fVar95 * (fVar144 + (fVar236 + auVar112._4_4_) * 0.33333334);
  auVar135._8_4_ = fVar95 * (fVar143 + (fVar238 + auVar112._8_4_) * 0.33333334);
  auVar135._12_4_ = fVar95 * (fVar164 + (fVar240 + auVar112._12_4_) * 0.33333334);
  auVar155._0_4_ = fVar95 * auVar23._0_4_;
  auVar155._4_4_ = fVar95 * auVar23._4_4_;
  auVar155._8_4_ = fVar95 * auVar23._8_4_;
  auVar155._12_4_ = fVar95 * auVar23._12_4_;
  auVar175._0_4_ = fVar95 * (float)local_618._0_4_;
  auVar175._4_4_ = fVar95 * (float)local_618._4_4_;
  auVar175._8_4_ = fVar95 * fStack_610;
  auVar175._12_4_ = fVar95 * fStack_60c;
  auVar169 = vfmadd231ps_fma(auVar76,auVar114,_local_648);
  auVar186 = vfmadd231ps_fma(auVar135,auVar114,auVar302);
  auVar201 = vfmadd231ps_fma(auVar155,auVar114,auVar173);
  auVar219 = vfmadd231ps_fma(auVar175,auVar114,_local_568);
  auVar124 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar124 = vinsertps_avx(auVar124,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar22 = vsubps_avx(auVar130,auVar124);
  auVar16 = vshufps_avx(auVar22,auVar22,0x55);
  auVar20 = vshufps_avx(auVar22,auVar22,0xaa);
  aVar7 = pre->ray_space[k].vy.field_0;
  fVar66 = pre->ray_space[k].vz.field_0.m128[0];
  fVar97 = pre->ray_space[k].vz.field_0.m128[1];
  fVar95 = pre->ray_space[k].vz.field_0.m128[2];
  fVar67 = pre->ray_space[k].vz.field_0.m128[3];
  auVar77._0_4_ = fVar66 * auVar20._0_4_;
  auVar77._4_4_ = fVar97 * auVar20._4_4_;
  auVar77._8_4_ = fVar95 * auVar20._8_4_;
  auVar77._12_4_ = fVar67 * auVar20._12_4_;
  auVar21 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar7,auVar16);
  auVar170 = vsubps_avx(auVar147,auVar124);
  auVar16 = vshufps_avx(auVar170,auVar170,0x55);
  auVar20 = vshufps_avx(auVar170,auVar170,0xaa);
  auVar326._0_4_ = fVar66 * auVar20._0_4_;
  auVar326._4_4_ = fVar97 * auVar20._4_4_;
  auVar326._8_4_ = fVar95 * auVar20._8_4_;
  auVar326._12_4_ = fVar67 * auVar20._12_4_;
  auVar20 = vfmadd231ps_fma(auVar326,(undefined1  [16])aVar7,auVar16);
  auVar267 = vsubps_avx(auVar148,auVar124);
  auVar16 = vshufps_avx(auVar267,auVar267,0xaa);
  auVar303._0_4_ = fVar66 * auVar16._0_4_;
  auVar303._4_4_ = fVar97 * auVar16._4_4_;
  auVar303._8_4_ = fVar95 * auVar16._8_4_;
  auVar303._12_4_ = fVar67 * auVar16._12_4_;
  auVar16 = vshufps_avx(auVar267,auVar267,0x55);
  auVar173 = vfmadd231ps_fma(auVar303,(undefined1  [16])aVar7,auVar16);
  auVar24 = vsubps_avx(auVar168,auVar124);
  auVar16 = vshufps_avx(auVar24,auVar24,0xaa);
  auVar316._0_4_ = fVar66 * auVar16._0_4_;
  auVar316._4_4_ = fVar97 * auVar16._4_4_;
  auVar316._8_4_ = fVar95 * auVar16._8_4_;
  auVar316._12_4_ = fVar67 * auVar16._12_4_;
  auVar16 = vshufps_avx(auVar24,auVar24,0x55);
  auVar23 = vfmadd231ps_fma(auVar316,(undefined1  [16])aVar7,auVar16);
  auVar108 = vsubps_avx(auVar169,auVar124);
  auVar16 = vshufps_avx(auVar108,auVar108,0xaa);
  auVar176._0_4_ = fVar66 * auVar16._0_4_;
  auVar176._4_4_ = fVar97 * auVar16._4_4_;
  auVar176._8_4_ = fVar95 * auVar16._8_4_;
  auVar176._12_4_ = fVar67 * auVar16._12_4_;
  auVar16 = vshufps_avx(auVar108,auVar108,0x55);
  auVar19 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar7,auVar16);
  auVar71 = vsubps_avx(auVar186,auVar124);
  auVar16 = vshufps_avx(auVar71,auVar71,0xaa);
  auVar225._0_4_ = fVar66 * auVar16._0_4_;
  auVar225._4_4_ = fVar97 * auVar16._4_4_;
  auVar225._8_4_ = fVar95 * auVar16._8_4_;
  auVar225._12_4_ = fVar67 * auVar16._12_4_;
  auVar16 = vshufps_avx(auVar71,auVar71,0x55);
  auVar131 = vfmadd231ps_fma(auVar225,(undefined1  [16])aVar7,auVar16);
  auVar101 = vsubps_avx(auVar201,auVar124);
  auVar16 = vshufps_avx(auVar101,auVar101,0xaa);
  auVar256._0_4_ = fVar66 * auVar16._0_4_;
  auVar256._4_4_ = fVar97 * auVar16._4_4_;
  auVar256._8_4_ = fVar95 * auVar16._8_4_;
  auVar256._12_4_ = fVar67 * auVar16._12_4_;
  auVar16 = vshufps_avx(auVar101,auVar101,0x55);
  auVar16 = vfmadd231ps_fma(auVar256,(undefined1  [16])aVar7,auVar16);
  auVar102 = vsubps_avx(auVar219,auVar124);
  auVar124 = vshufps_avx(auVar102,auVar102,0xaa);
  auVar190._0_4_ = fVar66 * auVar124._0_4_;
  auVar190._4_4_ = fVar97 * auVar124._4_4_;
  auVar190._8_4_ = fVar95 * auVar124._8_4_;
  auVar190._12_4_ = fVar67 * auVar124._12_4_;
  auVar124 = vshufps_avx(auVar102,auVar102,0x55);
  auVar124 = vfmadd231ps_fma(auVar190,(undefined1  [16])aVar7,auVar124);
  local_3b8 = auVar22._0_4_;
  auVar205._4_4_ = local_3b8;
  auVar205._0_4_ = local_3b8;
  auVar205._8_4_ = local_3b8;
  auVar205._12_4_ = local_3b8;
  aVar7 = pre->ray_space[k].vx.field_0;
  auVar146 = vfmadd231ps_fma(auVar21,(undefined1  [16])aVar7,auVar205);
  local_3c8 = auVar170._0_4_;
  auVar206._4_4_ = local_3c8;
  auVar206._0_4_ = local_3c8;
  auVar206._8_4_ = local_3c8;
  auVar206._12_4_ = local_3c8;
  auVar70 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar7,auVar206);
  uVar68 = auVar267._0_4_;
  auVar207._4_4_ = uVar68;
  auVar207._0_4_ = uVar68;
  auVar207._8_4_ = uVar68;
  auVar207._12_4_ = uVar68;
  auVar99 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar7,auVar207);
  uVar68 = auVar24._0_4_;
  auVar208._4_4_ = uVar68;
  auVar208._0_4_ = uVar68;
  auVar208._8_4_ = uVar68;
  auVar208._12_4_ = uVar68;
  auVar100 = vfmadd231ps_fma(auVar23,(undefined1  [16])aVar7,auVar208);
  uVar68 = auVar108._0_4_;
  auVar209._4_4_ = uVar68;
  auVar209._0_4_ = uVar68;
  auVar209._8_4_ = uVar68;
  auVar209._12_4_ = uVar68;
  auVar220 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar7,auVar209);
  uVar68 = auVar71._0_4_;
  auVar210._4_4_ = uVar68;
  auVar210._0_4_ = uVar68;
  auVar210._8_4_ = uVar68;
  auVar210._12_4_ = uVar68;
  auVar244 = vfmadd231ps_fma(auVar131,(undefined1  [16])aVar7,auVar210);
  uVar68 = auVar101._0_4_;
  auVar211._4_4_ = uVar68;
  auVar211._0_4_ = uVar68;
  auVar211._8_4_ = uVar68;
  auVar211._12_4_ = uVar68;
  auVar252 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar7,auVar211);
  uVar68 = auVar102._0_4_;
  auVar212._4_4_ = uVar68;
  auVar212._0_4_ = uVar68;
  auVar212._8_4_ = uVar68;
  auVar212._12_4_ = uVar68;
  auVar313 = vfmadd231ps_fma(auVar124,(undefined1  [16])aVar7,auVar212);
  auVar21 = vmovlhps_avx(auVar146,auVar220);
  auVar173 = vmovlhps_avx(auVar70,auVar244);
  auVar23 = vmovlhps_avx(auVar99,auVar252);
  auVar19 = vmovlhps_avx(auVar100,auVar313);
  auVar124 = vminps_avx(auVar21,auVar173);
  auVar16 = vminps_avx(auVar23,auVar19);
  auVar20 = vminps_avx(auVar124,auVar16);
  auVar124 = vmaxps_avx(auVar21,auVar173);
  auVar16 = vmaxps_avx(auVar23,auVar19);
  auVar124 = vmaxps_avx(auVar124,auVar16);
  auVar16 = vshufpd_avx(auVar20,auVar20,3);
  auVar20 = vminps_avx(auVar20,auVar16);
  auVar16 = vshufpd_avx(auVar124,auVar124,3);
  auVar16 = vmaxps_avx(auVar124,auVar16);
  auVar124 = vandps_avx(auVar69,auVar20);
  auVar16 = vandps_avx(auVar16,auVar69);
  auVar124 = vmaxps_avx(auVar124,auVar16);
  auVar16 = vmovshdup_avx(auVar124);
  auVar124 = vmaxss_avx(auVar16,auVar124);
  fVar97 = auVar124._0_4_ * 9.536743e-07;
  auVar246._8_8_ = auVar146._0_8_;
  auVar246._0_8_ = auVar146._0_8_;
  auVar268._8_8_ = auVar70._0_8_;
  auVar268._0_8_ = auVar70._0_8_;
  auVar304._0_8_ = auVar99._0_8_;
  auVar304._8_8_ = auVar304._0_8_;
  auVar317._0_8_ = auVar100._0_8_;
  auVar317._8_8_ = auVar317._0_8_;
  local_78 = fVar97;
  fStack_74 = fVar97;
  fStack_70 = fVar97;
  fStack_6c = fVar97;
  fStack_68 = fVar97;
  fStack_64 = fVar97;
  fStack_60 = fVar97;
  fStack_5c = fVar97;
  fStack_90 = -fVar97;
  local_98 = -fVar97;
  fStack_94 = -fVar97;
  fStack_8c = fStack_90;
  fStack_88 = fStack_90;
  fStack_84 = fStack_90;
  fStack_80 = fStack_90;
  fStack_7c = fStack_90;
  uVar59 = 0;
  fVar66 = *(float *)(ray + k * 4 + 0x30);
  auVar16 = vsubps_avx(auVar173,auVar21);
  auVar20 = vsubps_avx(auVar23,auVar173);
  auVar131 = vsubps_avx(auVar19,auVar23);
  auVar146 = vsubps_avx(auVar169,auVar130);
  auVar70 = vsubps_avx(auVar186,auVar147);
  auVar99 = vsubps_avx(auVar201,auVar148);
  auVar100 = vsubps_avx(auVar219,auVar168);
  auVar78 = ZEXT816(0x3f80000000000000);
  auVar124 = auVar78;
LAB_0123a6e5:
  auVar314 = vshufps_avx(auVar78,auVar78,0x50);
  auVar327._8_4_ = 0x3f800000;
  auVar327._0_8_ = 0x3f8000003f800000;
  auVar327._12_4_ = 0x3f800000;
  auVar330._16_4_ = 0x3f800000;
  auVar330._0_16_ = auVar327;
  auVar330._20_4_ = 0x3f800000;
  auVar330._24_4_ = 0x3f800000;
  auVar330._28_4_ = 0x3f800000;
  auVar323 = vsubps_avx(auVar327,auVar314);
  fVar95 = auVar314._0_4_;
  fVar167 = auVar220._0_4_;
  auVar79._0_4_ = fVar167 * fVar95;
  fVar67 = auVar314._4_4_;
  fVar184 = auVar220._4_4_;
  auVar79._4_4_ = fVar184 * fVar67;
  fVar145 = auVar314._8_4_;
  auVar79._8_4_ = fVar167 * fVar145;
  fVar144 = auVar314._12_4_;
  auVar79._12_4_ = fVar184 * fVar144;
  fVar218 = auVar244._0_4_;
  auVar213._0_4_ = fVar218 * fVar95;
  fVar237 = auVar244._4_4_;
  auVar213._4_4_ = fVar237 * fVar67;
  auVar213._8_4_ = fVar218 * fVar145;
  auVar213._12_4_ = fVar237 * fVar144;
  fVar239 = auVar252._0_4_;
  auVar177._0_4_ = fVar239 * fVar95;
  fVar235 = auVar252._4_4_;
  auVar177._4_4_ = fVar235 * fVar67;
  auVar177._8_4_ = fVar239 * fVar145;
  auVar177._12_4_ = fVar235 * fVar144;
  fVar185 = auVar313._0_4_;
  auVar136._0_4_ = fVar185 * fVar95;
  fVar200 = auVar313._4_4_;
  auVar136._4_4_ = fVar200 * fVar67;
  auVar136._8_4_ = fVar185 * fVar145;
  auVar136._12_4_ = fVar200 * fVar144;
  auVar288 = vfmadd231ps_fma(auVar79,auVar323,auVar246);
  auVar72 = vfmadd231ps_fma(auVar213,auVar323,auVar268);
  auVar73 = vfmadd231ps_fma(auVar177,auVar323,auVar304);
  auVar280 = vfmadd231ps_fma(auVar136,auVar317,auVar323);
  auVar314 = vmovshdup_avx(auVar124);
  fVar95 = auVar124._0_4_;
  fStack_140 = (auVar314._0_4_ - fVar95) * 0.04761905;
  auVar264._4_4_ = fVar95;
  auVar264._0_4_ = fVar95;
  auVar264._8_4_ = fVar95;
  auVar264._12_4_ = fVar95;
  auVar264._16_4_ = fVar95;
  auVar264._20_4_ = fVar95;
  auVar264._24_4_ = fVar95;
  auVar264._28_4_ = fVar95;
  auVar125._0_8_ = auVar314._0_8_;
  auVar125._8_8_ = auVar125._0_8_;
  auVar125._16_8_ = auVar125._0_8_;
  auVar125._24_8_ = auVar125._0_8_;
  auVar92 = vsubps_avx(auVar125,auVar264);
  uVar68 = auVar288._0_4_;
  auVar321._4_4_ = uVar68;
  auVar321._0_4_ = uVar68;
  auVar321._8_4_ = uVar68;
  auVar321._12_4_ = uVar68;
  auVar321._16_4_ = uVar68;
  auVar321._20_4_ = uVar68;
  auVar321._24_4_ = uVar68;
  auVar321._28_4_ = uVar68;
  auVar314 = vmovshdup_avx(auVar288);
  uVar98 = auVar314._0_8_;
  auVar312._8_8_ = uVar98;
  auVar312._0_8_ = uVar98;
  auVar312._16_8_ = uVar98;
  auVar312._24_8_ = uVar98;
  fVar234 = auVar72._0_4_;
  auVar293._4_4_ = fVar234;
  auVar293._0_4_ = fVar234;
  auVar293._8_4_ = fVar234;
  auVar293._12_4_ = fVar234;
  auVar293._16_4_ = fVar234;
  auVar293._20_4_ = fVar234;
  auVar293._24_4_ = fVar234;
  auVar293._28_4_ = fVar234;
  auVar323 = vmovshdup_avx(auVar72);
  auVar126._0_8_ = auVar323._0_8_;
  auVar126._8_8_ = auVar126._0_8_;
  auVar126._16_8_ = auVar126._0_8_;
  auVar126._24_8_ = auVar126._0_8_;
  fVar166 = auVar73._0_4_;
  auVar231._4_4_ = fVar166;
  auVar231._0_4_ = fVar166;
  auVar231._8_4_ = fVar166;
  auVar231._12_4_ = fVar166;
  auVar231._16_4_ = fVar166;
  auVar231._20_4_ = fVar166;
  auVar231._24_4_ = fVar166;
  auVar231._28_4_ = fVar166;
  auVar324 = vmovshdup_avx(auVar73);
  auVar250._0_8_ = auVar324._0_8_;
  auVar250._8_8_ = auVar250._0_8_;
  auVar250._16_8_ = auVar250._0_8_;
  auVar250._24_8_ = auVar250._0_8_;
  fVar165 = auVar280._0_4_;
  auVar18 = vmovshdup_avx(auVar280);
  auVar74 = vfmadd132ps_fma(auVar92,auVar264,_DAT_01f7b040);
  auVar92 = vsubps_avx(auVar330,ZEXT1632(auVar74));
  fVar95 = auVar74._0_4_;
  fVar67 = auVar74._4_4_;
  auVar25._4_4_ = fVar234 * fVar67;
  auVar25._0_4_ = fVar234 * fVar95;
  fVar145 = auVar74._8_4_;
  auVar25._8_4_ = fVar234 * fVar145;
  fVar144 = auVar74._12_4_;
  auVar25._12_4_ = fVar234 * fVar144;
  auVar25._16_4_ = fVar234 * 0.0;
  auVar25._20_4_ = fVar234 * 0.0;
  auVar25._24_4_ = fVar234 * 0.0;
  auVar25._28_4_ = 0x3f800000;
  auVar74 = vfmadd231ps_fma(auVar25,auVar92,auVar321);
  fVar143 = auVar323._0_4_;
  fVar164 = auVar323._4_4_;
  auVar26._4_4_ = fVar164 * fVar67;
  auVar26._0_4_ = fVar143 * fVar95;
  auVar26._8_4_ = fVar143 * fVar145;
  auVar26._12_4_ = fVar164 * fVar144;
  auVar26._16_4_ = fVar143 * 0.0;
  auVar26._20_4_ = fVar164 * 0.0;
  auVar26._24_4_ = fVar143 * 0.0;
  auVar26._28_4_ = uVar68;
  auVar75 = vfmadd231ps_fma(auVar26,auVar92,auVar312);
  auVar27._4_4_ = fVar166 * fVar67;
  auVar27._0_4_ = fVar166 * fVar95;
  auVar27._8_4_ = fVar166 * fVar145;
  auVar27._12_4_ = fVar166 * fVar144;
  auVar27._16_4_ = fVar166 * 0.0;
  auVar27._20_4_ = fVar166 * 0.0;
  auVar27._24_4_ = fVar166 * 0.0;
  auVar27._28_4_ = auVar314._4_4_;
  auVar157 = vfmadd231ps_fma(auVar27,auVar92,auVar293);
  fVar143 = auVar324._0_4_;
  fVar164 = auVar324._4_4_;
  auVar17._4_4_ = fVar164 * fVar67;
  auVar17._0_4_ = fVar143 * fVar95;
  auVar17._8_4_ = fVar143 * fVar145;
  auVar17._12_4_ = fVar164 * fVar144;
  auVar17._16_4_ = fVar143 * 0.0;
  auVar17._20_4_ = fVar164 * 0.0;
  auVar17._24_4_ = fVar143 * 0.0;
  auVar17._28_4_ = fVar234;
  auVar76 = vfmadd231ps_fma(auVar17,auVar92,auVar126);
  auVar314 = vshufps_avx(auVar288,auVar288,0xaa);
  uStack_560 = auVar314._0_8_;
  local_568 = (undefined1  [8])uStack_560;
  uStack_558 = uStack_560;
  uStack_550 = uStack_560;
  auVar323 = vshufps_avx(auVar288,auVar288,0xff);
  uStack_640 = auVar323._0_8_;
  local_648 = (undefined1  [8])uStack_640;
  uStack_638 = uStack_640;
  uStack_630 = uStack_640;
  auVar28._4_4_ = fVar165 * fVar67;
  auVar28._0_4_ = fVar165 * fVar95;
  auVar28._8_4_ = fVar165 * fVar145;
  auVar28._12_4_ = fVar165 * fVar144;
  auVar28._16_4_ = fVar165 * 0.0;
  auVar28._20_4_ = fVar165 * 0.0;
  auVar28._24_4_ = fVar165 * 0.0;
  auVar28._28_4_ = fVar165;
  auVar288 = vfmadd231ps_fma(auVar28,auVar92,auVar231);
  auVar323 = vshufps_avx(auVar72,auVar72,0xaa);
  auVar232._0_8_ = auVar323._0_8_;
  auVar232._8_8_ = auVar232._0_8_;
  auVar232._16_8_ = auVar232._0_8_;
  auVar232._24_8_ = auVar232._0_8_;
  auVar324 = vshufps_avx(auVar72,auVar72,0xff);
  local_518._8_8_ = auVar324._0_8_;
  local_518._0_8_ = local_518._8_8_;
  local_518._16_8_ = local_518._8_8_;
  local_518._24_8_ = local_518._8_8_;
  fVar143 = auVar18._0_4_;
  fVar164 = auVar18._4_4_;
  auVar29._4_4_ = fVar164 * fVar67;
  auVar29._0_4_ = fVar143 * fVar95;
  auVar29._8_4_ = fVar143 * fVar145;
  auVar29._12_4_ = fVar164 * fVar144;
  auVar29._16_4_ = fVar143 * 0.0;
  auVar29._20_4_ = fVar164 * 0.0;
  auVar29._24_4_ = fVar143 * 0.0;
  auVar29._28_4_ = auVar314._4_4_;
  auVar77 = vfmadd231ps_fma(auVar29,auVar92,auVar250);
  auVar30._28_4_ = fVar164;
  auVar30._0_28_ =
       ZEXT1628(CONCAT412(auVar157._12_4_ * fVar144,
                          CONCAT48(auVar157._8_4_ * fVar145,
                                   CONCAT44(auVar157._4_4_ * fVar67,auVar157._0_4_ * fVar95))));
  auVar74 = vfmadd231ps_fma(auVar30,auVar92,ZEXT1632(auVar74));
  fVar143 = auVar324._4_4_;
  auVar31._28_4_ = fVar143;
  auVar31._0_28_ =
       ZEXT1628(CONCAT412(auVar76._12_4_ * fVar144,
                          CONCAT48(auVar76._8_4_ * fVar145,
                                   CONCAT44(auVar76._4_4_ * fVar67,auVar76._0_4_ * fVar95))));
  auVar75 = vfmadd231ps_fma(auVar31,auVar92,ZEXT1632(auVar75));
  auVar314 = vshufps_avx(auVar73,auVar73,0xaa);
  uVar98 = auVar314._0_8_;
  auVar217._8_8_ = uVar98;
  auVar217._0_8_ = uVar98;
  auVar217._16_8_ = uVar98;
  auVar217._24_8_ = uVar98;
  auVar18 = vshufps_avx(auVar73,auVar73,0xff);
  uVar98 = auVar18._0_8_;
  auVar331._8_8_ = uVar98;
  auVar331._0_8_ = uVar98;
  auVar331._16_8_ = uVar98;
  auVar331._24_8_ = uVar98;
  auVar73 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar288._12_4_ * fVar144,
                                               CONCAT48(auVar288._8_4_ * fVar145,
                                                        CONCAT44(auVar288._4_4_ * fVar67,
                                                                 auVar288._0_4_ * fVar95)))),auVar92
                            ,ZEXT1632(auVar157));
  auVar288 = vshufps_avx(auVar280,auVar280,0xaa);
  auVar72 = vshufps_avx(auVar280,auVar280,0xff);
  auVar280 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar144 * auVar77._12_4_,
                                                CONCAT48(fVar145 * auVar77._8_4_,
                                                         CONCAT44(fVar67 * auVar77._4_4_,
                                                                  fVar95 * auVar77._0_4_)))),auVar92
                             ,ZEXT1632(auVar76));
  auVar157 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar144 * auVar73._12_4_,
                                                CONCAT48(fVar145 * auVar73._8_4_,
                                                         CONCAT44(fVar67 * auVar73._4_4_,
                                                                  fVar95 * auVar73._0_4_)))),auVar92
                             ,ZEXT1632(auVar74));
  auVar25 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar74));
  auVar73 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar144 * auVar280._12_4_,
                                               CONCAT48(fVar145 * auVar280._8_4_,
                                                        CONCAT44(fVar67 * auVar280._4_4_,
                                                                 fVar95 * auVar280._0_4_)))),auVar92
                            ,ZEXT1632(auVar75));
  auVar26 = vsubps_avx(ZEXT1632(auVar280),ZEXT1632(auVar75));
  fStack_4dc = auVar26._28_4_;
  auVar294._0_4_ = fStack_140 * auVar25._0_4_ * 3.0;
  auVar294._4_4_ = fStack_140 * auVar25._4_4_ * 3.0;
  auVar294._8_4_ = fStack_140 * auVar25._8_4_ * 3.0;
  auVar294._12_4_ = fStack_140 * auVar25._12_4_ * 3.0;
  auVar294._16_4_ = fStack_140 * auVar25._16_4_ * 3.0;
  auVar294._20_4_ = fStack_140 * auVar25._20_4_ * 3.0;
  auVar294._24_4_ = fStack_140 * auVar25._24_4_ * 3.0;
  auVar294._28_4_ = 0;
  local_4f8._0_4_ = fStack_140 * auVar26._0_4_ * 3.0;
  local_4f8._4_4_ = fStack_140 * auVar26._4_4_ * 3.0;
  fStack_4f0 = fStack_140 * auVar26._8_4_ * 3.0;
  fStack_4ec = fStack_140 * auVar26._12_4_ * 3.0;
  fStack_4e8 = fStack_140 * auVar26._16_4_ * 3.0;
  fStack_4e4 = fStack_140 * auVar26._20_4_ * 3.0;
  fStack_4e0 = fStack_140 * auVar26._24_4_ * 3.0;
  fVar164 = auVar323._0_4_;
  fVar165 = auVar323._4_4_;
  auVar32._4_4_ = fVar165 * fVar67;
  auVar32._0_4_ = fVar164 * fVar95;
  auVar32._8_4_ = fVar164 * fVar145;
  auVar32._12_4_ = fVar165 * fVar144;
  auVar32._16_4_ = fVar164 * 0.0;
  auVar32._20_4_ = fVar165 * 0.0;
  auVar32._24_4_ = fVar164 * 0.0;
  auVar32._28_4_ = fStack_4dc;
  auVar323 = vfmadd231ps_fma(auVar32,auVar92,_local_568);
  fVar164 = auVar324._0_4_;
  auVar295._4_4_ = fVar143 * fVar67;
  auVar295._0_4_ = fVar164 * fVar95;
  auVar295._8_4_ = fVar164 * fVar145;
  auVar295._12_4_ = fVar143 * fVar144;
  auVar295._16_4_ = fVar164 * 0.0;
  auVar295._20_4_ = fVar143 * 0.0;
  auVar295._24_4_ = fVar164 * 0.0;
  auVar295._28_4_ = 0;
  auVar324 = vfmadd231ps_fma(auVar295,auVar92,_local_648);
  fVar143 = auVar314._0_4_;
  fVar164 = auVar314._4_4_;
  auVar34._4_4_ = fVar164 * fVar67;
  auVar34._0_4_ = fVar143 * fVar95;
  auVar34._8_4_ = fVar143 * fVar145;
  auVar34._12_4_ = fVar164 * fVar144;
  auVar34._16_4_ = fVar143 * 0.0;
  auVar34._20_4_ = fVar164 * 0.0;
  auVar34._24_4_ = fVar143 * 0.0;
  auVar34._28_4_ = auVar25._28_4_;
  auVar314 = vfmadd231ps_fma(auVar34,auVar92,auVar232);
  fVar143 = auVar18._0_4_;
  fVar166 = auVar18._4_4_;
  auVar35._4_4_ = fVar166 * fVar67;
  auVar35._0_4_ = fVar143 * fVar95;
  auVar35._8_4_ = fVar143 * fVar145;
  auVar35._12_4_ = fVar166 * fVar144;
  auVar35._16_4_ = fVar143 * 0.0;
  auVar35._20_4_ = fVar166 * 0.0;
  auVar35._24_4_ = fVar143 * 0.0;
  auVar35._28_4_ = fVar165;
  auVar18 = vfmadd231ps_fma(auVar35,auVar92,local_518);
  auVar28 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar157));
  fVar143 = auVar288._0_4_;
  fVar164 = auVar288._4_4_;
  auVar36._4_4_ = fVar164 * fVar67;
  auVar36._0_4_ = fVar143 * fVar95;
  auVar36._8_4_ = fVar143 * fVar145;
  auVar36._12_4_ = fVar164 * fVar144;
  auVar36._16_4_ = fVar143 * 0.0;
  auVar36._20_4_ = fVar164 * 0.0;
  auVar36._24_4_ = fVar143 * 0.0;
  auVar36._28_4_ = fVar164;
  auVar288 = vfmadd231ps_fma(auVar36,auVar92,auVar217);
  auVar29 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar73));
  fVar143 = auVar72._0_4_;
  fVar164 = auVar72._4_4_;
  auVar37._4_4_ = fVar164 * fVar67;
  auVar37._0_4_ = fVar143 * fVar95;
  auVar37._8_4_ = fVar143 * fVar145;
  auVar37._12_4_ = fVar164 * fVar144;
  auVar37._16_4_ = fVar143 * 0.0;
  auVar37._20_4_ = fVar164 * 0.0;
  auVar37._24_4_ = fVar143 * 0.0;
  auVar37._28_4_ = fVar164;
  auVar72 = vfmadd231ps_fma(auVar37,auVar92,auVar331);
  auVar38._28_4_ = fVar166;
  auVar38._0_28_ =
       ZEXT1628(CONCAT412(auVar314._12_4_ * fVar144,
                          CONCAT48(auVar314._8_4_ * fVar145,
                                   CONCAT44(auVar314._4_4_ * fVar67,auVar314._0_4_ * fVar95))));
  auVar323 = vfmadd231ps_fma(auVar38,auVar92,ZEXT1632(auVar323));
  auVar324 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar144 * auVar18._12_4_,
                                                CONCAT48(fVar145 * auVar18._8_4_,
                                                         CONCAT44(fVar67 * auVar18._4_4_,
                                                                  fVar95 * auVar18._0_4_)))),auVar92
                             ,ZEXT1632(auVar324));
  auVar127._0_4_ = auVar157._0_4_ + auVar294._0_4_;
  auVar127._4_4_ = auVar157._4_4_ + auVar294._4_4_;
  auVar127._8_4_ = auVar157._8_4_ + auVar294._8_4_;
  auVar127._12_4_ = auVar157._12_4_ + auVar294._12_4_;
  auVar127._16_4_ = auVar294._16_4_ + 0.0;
  auVar127._20_4_ = auVar294._20_4_ + 0.0;
  auVar127._24_4_ = auVar294._24_4_ + 0.0;
  auVar127._28_4_ = 0;
  auVar314 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar288._12_4_ * fVar144,
                                                CONCAT48(auVar288._8_4_ * fVar145,
                                                         CONCAT44(auVar288._4_4_ * fVar67,
                                                                  auVar288._0_4_ * fVar95)))),
                             auVar92,ZEXT1632(auVar314));
  auVar18 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar72._12_4_ * fVar144,
                                               CONCAT48(auVar72._8_4_ * fVar145,
                                                        CONCAT44(auVar72._4_4_ * fVar67,
                                                                 auVar72._0_4_ * fVar95)))),auVar92,
                            ZEXT1632(auVar18));
  auVar288 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar144 * auVar314._12_4_,
                                                CONCAT48(fVar145 * auVar314._8_4_,
                                                         CONCAT44(fVar67 * auVar314._4_4_,
                                                                  fVar95 * auVar314._0_4_)))),
                             auVar92,ZEXT1632(auVar323));
  auVar72 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar18._12_4_ * fVar144,
                                               CONCAT48(auVar18._8_4_ * fVar145,
                                                        CONCAT44(auVar18._4_4_ * fVar67,
                                                                 auVar18._0_4_ * fVar95)))),
                            ZEXT1632(auVar324),auVar92);
  auVar92 = vsubps_avx(ZEXT1632(auVar314),ZEXT1632(auVar323));
  auVar25 = vsubps_avx(ZEXT1632(auVar18),ZEXT1632(auVar324));
  auVar322._0_4_ = fStack_140 * auVar92._0_4_ * 3.0;
  auVar322._4_4_ = fStack_140 * auVar92._4_4_ * 3.0;
  auVar322._8_4_ = fStack_140 * auVar92._8_4_ * 3.0;
  auVar322._12_4_ = fStack_140 * auVar92._12_4_ * 3.0;
  auVar322._16_4_ = fStack_140 * auVar92._16_4_ * 3.0;
  auVar322._20_4_ = fStack_140 * auVar92._20_4_ * 3.0;
  auVar322._24_4_ = fStack_140 * auVar92._24_4_ * 3.0;
  auVar322._28_4_ = 0;
  local_158 = fStack_140 * auVar25._0_4_ * 3.0;
  fStack_154 = fStack_140 * auVar25._4_4_ * 3.0;
  auVar39._4_4_ = fStack_154;
  auVar39._0_4_ = local_158;
  fStack_150 = fStack_140 * auVar25._8_4_ * 3.0;
  auVar39._8_4_ = fStack_150;
  fStack_14c = fStack_140 * auVar25._12_4_ * 3.0;
  auVar39._12_4_ = fStack_14c;
  fStack_148 = fStack_140 * auVar25._16_4_ * 3.0;
  auVar39._16_4_ = fStack_148;
  fStack_144 = fStack_140 * auVar25._20_4_ * 3.0;
  auVar39._20_4_ = fStack_144;
  fStack_140 = fStack_140 * auVar25._24_4_ * 3.0;
  auVar39._24_4_ = fStack_140;
  auVar39._28_4_ = 0x40400000;
  auVar30 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar288));
  auVar31 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar72));
  auVar92 = vsubps_avx(ZEXT1632(auVar288),ZEXT1632(auVar157));
  auVar25 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar73));
  auVar26 = vsubps_avx(auVar30,auVar28);
  fVar234 = auVar92._0_4_ + auVar26._0_4_;
  fVar236 = auVar92._4_4_ + auVar26._4_4_;
  fVar238 = auVar92._8_4_ + auVar26._8_4_;
  fVar240 = auVar92._12_4_ + auVar26._12_4_;
  fVar241 = auVar92._16_4_ + auVar26._16_4_;
  fVar242 = auVar92._20_4_ + auVar26._20_4_;
  fVar243 = auVar92._24_4_ + auVar26._24_4_;
  auVar27 = vsubps_avx(auVar31,auVar29);
  auVar93._0_4_ = auVar25._0_4_ + auVar27._0_4_;
  auVar93._4_4_ = auVar25._4_4_ + auVar27._4_4_;
  auVar93._8_4_ = auVar25._8_4_ + auVar27._8_4_;
  auVar93._12_4_ = auVar25._12_4_ + auVar27._12_4_;
  auVar93._16_4_ = auVar25._16_4_ + auVar27._16_4_;
  auVar93._20_4_ = auVar25._20_4_ + auVar27._20_4_;
  auVar93._24_4_ = auVar25._24_4_ + auVar27._24_4_;
  auVar93._28_4_ = auVar25._28_4_ + auVar27._28_4_;
  local_f8 = ZEXT1632(auVar73);
  fVar95 = auVar73._0_4_;
  local_178 = (float)local_4f8._0_4_ + fVar95;
  fVar67 = auVar73._4_4_;
  fStack_174 = (float)local_4f8._4_4_ + fVar67;
  fVar145 = auVar73._8_4_;
  fStack_170 = fStack_4f0 + fVar145;
  fVar144 = auVar73._12_4_;
  fStack_16c = fStack_4ec + fVar144;
  fStack_168 = fStack_4e8 + 0.0;
  fStack_164 = fStack_4e4 + 0.0;
  fStack_160 = fStack_4e0 + 0.0;
  local_b8 = ZEXT1632(auVar157);
  auVar25 = vsubps_avx(local_b8,auVar294);
  local_d8 = vpermps_avx2(_DAT_01fb7720,auVar25);
  auVar25 = vsubps_avx(local_f8,_local_4f8);
  local_198 = vpermps_avx2(_DAT_01fb7720,auVar25);
  local_118._0_4_ = auVar288._0_4_ + auVar322._0_4_;
  local_118._4_4_ = auVar288._4_4_ + auVar322._4_4_;
  local_118._8_4_ = auVar288._8_4_ + auVar322._8_4_;
  local_118._12_4_ = auVar288._12_4_ + auVar322._12_4_;
  local_118._16_4_ = auVar322._16_4_ + 0.0;
  local_118._20_4_ = auVar322._20_4_ + 0.0;
  local_118._24_4_ = auVar322._24_4_ + 0.0;
  local_118._28_4_ = 0;
  auVar295 = ZEXT1632(auVar288);
  auVar25 = vsubps_avx(auVar295,auVar322);
  auVar32 = vpermps_avx2(_DAT_01fb7720,auVar25);
  fVar143 = auVar72._0_4_;
  local_158 = fVar143 + local_158;
  fVar164 = auVar72._4_4_;
  fStack_154 = fVar164 + fStack_154;
  fVar165 = auVar72._8_4_;
  fStack_150 = fVar165 + fStack_150;
  fVar166 = auVar72._12_4_;
  fStack_14c = fVar166 + fStack_14c;
  fStack_148 = fStack_148 + 0.0;
  fStack_144 = fStack_144 + 0.0;
  fStack_140 = fStack_140 + 0.0;
  auVar25 = vsubps_avx(ZEXT1632(auVar72),auVar39);
  local_138 = vpermps_avx2(_DAT_01fb7720,auVar25);
  auVar40._4_4_ = fVar67 * fVar236;
  auVar40._0_4_ = fVar95 * fVar234;
  auVar40._8_4_ = fVar145 * fVar238;
  auVar40._12_4_ = fVar144 * fVar240;
  auVar40._16_4_ = fVar241 * 0.0;
  auVar40._20_4_ = fVar242 * 0.0;
  auVar40._24_4_ = fVar243 * 0.0;
  auVar40._28_4_ = auVar25._28_4_;
  auVar314 = vfnmadd231ps_fma(auVar40,local_b8,auVar93);
  fStack_15c = fStack_4dc + 0.0;
  auVar41._4_4_ = fStack_174 * fVar236;
  auVar41._0_4_ = local_178 * fVar234;
  auVar41._8_4_ = fStack_170 * fVar238;
  auVar41._12_4_ = fStack_16c * fVar240;
  auVar41._16_4_ = fStack_168 * fVar241;
  auVar41._20_4_ = fStack_164 * fVar242;
  auVar41._24_4_ = fStack_160 * fVar243;
  auVar41._28_4_ = 0;
  auVar323 = vfnmadd231ps_fma(auVar41,auVar93,auVar127);
  auVar42._4_4_ = local_198._4_4_ * fVar236;
  auVar42._0_4_ = local_198._0_4_ * fVar234;
  auVar42._8_4_ = local_198._8_4_ * fVar238;
  auVar42._12_4_ = local_198._12_4_ * fVar240;
  auVar42._16_4_ = local_198._16_4_ * fVar241;
  auVar42._20_4_ = local_198._20_4_ * fVar242;
  auVar42._24_4_ = local_198._24_4_ * fVar243;
  auVar42._28_4_ = fStack_4dc + 0.0;
  auVar324 = vfnmadd231ps_fma(auVar42,local_d8,auVar93);
  local_648._0_4_ = auVar29._0_4_;
  local_648._4_4_ = auVar29._4_4_;
  uStack_640._0_4_ = auVar29._8_4_;
  uStack_640._4_4_ = auVar29._12_4_;
  uStack_638._0_4_ = auVar29._16_4_;
  uStack_638._4_4_ = auVar29._20_4_;
  uStack_630._0_4_ = auVar29._24_4_;
  uStack_630._4_4_ = auVar29._28_4_;
  auVar43._4_4_ = (float)local_648._4_4_ * fVar236;
  auVar43._0_4_ = (float)local_648._0_4_ * fVar234;
  auVar43._8_4_ = (float)uStack_640 * fVar238;
  auVar43._12_4_ = uStack_640._4_4_ * fVar240;
  auVar43._16_4_ = (float)uStack_638 * fVar241;
  auVar43._20_4_ = uStack_638._4_4_ * fVar242;
  auVar43._24_4_ = (float)uStack_630 * fVar243;
  auVar43._28_4_ = uStack_630._4_4_;
  auVar18 = vfnmadd231ps_fma(auVar43,auVar28,auVar93);
  auVar251._0_4_ = fVar143 * fVar234;
  auVar251._4_4_ = fVar164 * fVar236;
  auVar251._8_4_ = fVar165 * fVar238;
  auVar251._12_4_ = fVar166 * fVar240;
  auVar251._16_4_ = fVar241 * 0.0;
  auVar251._20_4_ = fVar242 * 0.0;
  auVar251._24_4_ = fVar243 * 0.0;
  auVar251._28_4_ = 0;
  auVar288 = vfnmadd231ps_fma(auVar251,auVar295,auVar93);
  uStack_13c = 0x40400000;
  auVar44._4_4_ = fStack_154 * fVar236;
  auVar44._0_4_ = local_158 * fVar234;
  auVar44._8_4_ = fStack_150 * fVar238;
  auVar44._12_4_ = fStack_14c * fVar240;
  auVar44._16_4_ = fStack_148 * fVar241;
  auVar44._20_4_ = fStack_144 * fVar242;
  auVar44._24_4_ = fStack_140 * fVar243;
  auVar44._28_4_ = auVar28._28_4_;
  auVar73 = vfnmadd231ps_fma(auVar44,local_118,auVar93);
  auVar45._4_4_ = local_138._4_4_ * fVar236;
  auVar45._0_4_ = local_138._0_4_ * fVar234;
  auVar45._8_4_ = local_138._8_4_ * fVar238;
  auVar45._12_4_ = local_138._12_4_ * fVar240;
  auVar45._16_4_ = local_138._16_4_ * fVar241;
  auVar45._20_4_ = local_138._20_4_ * fVar242;
  auVar45._24_4_ = local_138._24_4_ * fVar243;
  auVar45._28_4_ = local_138._28_4_;
  auVar280 = vfnmadd231ps_fma(auVar45,auVar32,auVar93);
  auVar46._4_4_ = auVar31._4_4_ * fVar236;
  auVar46._0_4_ = auVar31._0_4_ * fVar234;
  auVar46._8_4_ = auVar31._8_4_ * fVar238;
  auVar46._12_4_ = auVar31._12_4_ * fVar240;
  auVar46._16_4_ = auVar31._16_4_ * fVar241;
  auVar46._20_4_ = auVar31._20_4_ * fVar242;
  auVar46._24_4_ = auVar31._24_4_ * fVar243;
  auVar46._28_4_ = auVar92._28_4_ + auVar26._28_4_;
  auVar74 = vfnmadd231ps_fma(auVar46,auVar30,auVar93);
  auVar25 = vminps_avx(ZEXT1632(auVar314),ZEXT1632(auVar323));
  auVar92 = vmaxps_avx(ZEXT1632(auVar314),ZEXT1632(auVar323));
  auVar26 = vminps_avx(ZEXT1632(auVar324),ZEXT1632(auVar18));
  auVar26 = vminps_avx(auVar25,auVar26);
  auVar25 = vmaxps_avx(ZEXT1632(auVar324),ZEXT1632(auVar18));
  auVar92 = vmaxps_avx(auVar92,auVar25);
  auVar27 = vminps_avx(ZEXT1632(auVar288),ZEXT1632(auVar73));
  auVar25 = vmaxps_avx(ZEXT1632(auVar288),ZEXT1632(auVar73));
  auVar17 = vminps_avx(ZEXT1632(auVar280),ZEXT1632(auVar74));
  auVar27 = vminps_avx(auVar27,auVar17);
  auVar27 = vminps_avx(auVar26,auVar27);
  auVar26 = vmaxps_avx(ZEXT1632(auVar280),ZEXT1632(auVar74));
  auVar25 = vmaxps_avx(auVar25,auVar26);
  auVar25 = vmaxps_avx(auVar92,auVar25);
  auVar55._4_4_ = fStack_74;
  auVar55._0_4_ = local_78;
  auVar55._8_4_ = fStack_70;
  auVar55._12_4_ = fStack_6c;
  auVar55._16_4_ = fStack_68;
  auVar55._20_4_ = fStack_64;
  auVar55._24_4_ = fStack_60;
  auVar55._28_4_ = fStack_5c;
  auVar92 = vcmpps_avx(auVar27,auVar55,2);
  auVar54._4_4_ = fStack_94;
  auVar54._0_4_ = local_98;
  auVar54._8_4_ = fStack_90;
  auVar54._12_4_ = fStack_8c;
  auVar54._16_4_ = fStack_88;
  auVar54._20_4_ = fStack_84;
  auVar54._24_4_ = fStack_80;
  auVar54._28_4_ = fStack_7c;
  auVar25 = vcmpps_avx(auVar25,auVar54,5);
  auVar92 = vandps_avx(auVar25,auVar92);
  auVar25 = local_1b8 & auVar92;
  if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar25 >> 0x7f,0) != '\0') ||
        (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar25 >> 0xbf,0) != '\0') ||
      (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar25[0x1f] < '\0') {
    auVar25 = vsubps_avx(auVar28,local_b8);
    auVar26 = vsubps_avx(auVar30,auVar295);
    fVar236 = auVar25._0_4_ + auVar26._0_4_;
    fVar238 = auVar25._4_4_ + auVar26._4_4_;
    fVar240 = auVar25._8_4_ + auVar26._8_4_;
    fVar241 = auVar25._12_4_ + auVar26._12_4_;
    fVar242 = auVar25._16_4_ + auVar26._16_4_;
    fVar243 = auVar25._20_4_ + auVar26._20_4_;
    fVar96 = auVar25._24_4_ + auVar26._24_4_;
    auVar27 = vsubps_avx(auVar29,local_f8);
    auVar17 = vsubps_avx(auVar31,ZEXT1632(auVar72));
    auVar128._0_4_ = auVar27._0_4_ + auVar17._0_4_;
    auVar128._4_4_ = auVar27._4_4_ + auVar17._4_4_;
    auVar128._8_4_ = auVar27._8_4_ + auVar17._8_4_;
    auVar128._12_4_ = auVar27._12_4_ + auVar17._12_4_;
    auVar128._16_4_ = auVar27._16_4_ + auVar17._16_4_;
    auVar128._20_4_ = auVar27._20_4_ + auVar17._20_4_;
    auVar128._24_4_ = auVar27._24_4_ + auVar17._24_4_;
    fVar234 = auVar17._28_4_;
    auVar128._28_4_ = auVar27._28_4_ + fVar234;
    auVar47._4_4_ = fVar67 * fVar238;
    auVar47._0_4_ = fVar95 * fVar236;
    auVar47._8_4_ = fVar145 * fVar240;
    auVar47._12_4_ = fVar144 * fVar241;
    auVar47._16_4_ = fVar242 * 0.0;
    auVar47._20_4_ = fVar243 * 0.0;
    auVar47._24_4_ = fVar96 * 0.0;
    auVar47._28_4_ = auVar31._28_4_;
    auVar288 = vfnmadd231ps_fma(auVar47,auVar128,local_b8);
    auVar48._4_4_ = fVar238 * fStack_174;
    auVar48._0_4_ = fVar236 * local_178;
    auVar48._8_4_ = fVar240 * fStack_170;
    auVar48._12_4_ = fVar241 * fStack_16c;
    auVar48._16_4_ = fVar242 * fStack_168;
    auVar48._20_4_ = fVar243 * fStack_164;
    auVar48._24_4_ = fVar96 * fStack_160;
    auVar48._28_4_ = 0;
    auVar314 = vfnmadd213ps_fma(auVar127,auVar128,auVar48);
    auVar49._4_4_ = fVar238 * local_198._4_4_;
    auVar49._0_4_ = fVar236 * local_198._0_4_;
    auVar49._8_4_ = fVar240 * local_198._8_4_;
    auVar49._12_4_ = fVar241 * local_198._12_4_;
    auVar49._16_4_ = fVar242 * local_198._16_4_;
    auVar49._20_4_ = fVar243 * local_198._20_4_;
    auVar49._24_4_ = fVar96 * local_198._24_4_;
    auVar49._28_4_ = 0;
    auVar323 = vfnmadd213ps_fma(local_d8,auVar128,auVar49);
    auVar50._4_4_ = (float)local_648._4_4_ * fVar238;
    auVar50._0_4_ = (float)local_648._0_4_ * fVar236;
    auVar50._8_4_ = (float)uStack_640 * fVar240;
    auVar50._12_4_ = uStack_640._4_4_ * fVar241;
    auVar50._16_4_ = (float)uStack_638 * fVar242;
    auVar50._20_4_ = uStack_638._4_4_ * fVar243;
    auVar50._24_4_ = (float)uStack_630 * fVar96;
    auVar50._28_4_ = 0;
    auVar72 = vfnmadd231ps_fma(auVar50,auVar128,auVar28);
    auVar162._0_4_ = fVar143 * fVar236;
    auVar162._4_4_ = fVar164 * fVar238;
    auVar162._8_4_ = fVar165 * fVar240;
    auVar162._12_4_ = fVar166 * fVar241;
    auVar162._16_4_ = fVar242 * 0.0;
    auVar162._20_4_ = fVar243 * 0.0;
    auVar162._24_4_ = fVar96 * 0.0;
    auVar162._28_4_ = 0;
    auVar73 = vfnmadd231ps_fma(auVar162,auVar128,auVar295);
    auVar51._4_4_ = fVar238 * fStack_154;
    auVar51._0_4_ = fVar236 * local_158;
    auVar51._8_4_ = fVar240 * fStack_150;
    auVar51._12_4_ = fVar241 * fStack_14c;
    auVar51._16_4_ = fVar242 * fStack_148;
    auVar51._20_4_ = fVar243 * fStack_144;
    auVar51._24_4_ = fVar96 * fStack_140;
    auVar51._28_4_ = fVar234;
    auVar324 = vfnmadd213ps_fma(local_118,auVar128,auVar51);
    auVar52._4_4_ = fVar238 * local_138._4_4_;
    auVar52._0_4_ = fVar236 * local_138._0_4_;
    auVar52._8_4_ = fVar240 * local_138._8_4_;
    auVar52._12_4_ = fVar241 * local_138._12_4_;
    auVar52._16_4_ = fVar242 * local_138._16_4_;
    auVar52._20_4_ = fVar243 * local_138._20_4_;
    auVar52._24_4_ = fVar96 * local_138._24_4_;
    auVar52._28_4_ = fVar234;
    auVar18 = vfnmadd213ps_fma(auVar32,auVar128,auVar52);
    auVar53._4_4_ = fVar238 * auVar31._4_4_;
    auVar53._0_4_ = fVar236 * auVar31._0_4_;
    auVar53._8_4_ = fVar240 * auVar31._8_4_;
    auVar53._12_4_ = fVar241 * auVar31._12_4_;
    auVar53._16_4_ = fVar242 * auVar31._16_4_;
    auVar53._20_4_ = fVar243 * auVar31._20_4_;
    auVar53._24_4_ = fVar96 * auVar31._24_4_;
    auVar53._28_4_ = auVar25._28_4_ + auVar26._28_4_;
    auVar280 = vfnmadd231ps_fma(auVar53,auVar128,auVar30);
    auVar26 = vminps_avx(ZEXT1632(auVar288),ZEXT1632(auVar314));
    auVar25 = vmaxps_avx(ZEXT1632(auVar288),ZEXT1632(auVar314));
    auVar27 = vminps_avx(ZEXT1632(auVar323),ZEXT1632(auVar72));
    auVar27 = vminps_avx(auVar26,auVar27);
    auVar26 = vmaxps_avx(ZEXT1632(auVar323),ZEXT1632(auVar72));
    auVar25 = vmaxps_avx(auVar25,auVar26);
    auVar17 = vminps_avx(ZEXT1632(auVar73),ZEXT1632(auVar324));
    auVar26 = vmaxps_avx(ZEXT1632(auVar73),ZEXT1632(auVar324));
    auVar28 = vminps_avx(ZEXT1632(auVar18),ZEXT1632(auVar280));
    auVar17 = vminps_avx(auVar17,auVar28);
    auVar17 = vminps_avx(auVar27,auVar17);
    auVar27 = vmaxps_avx(ZEXT1632(auVar18),ZEXT1632(auVar280));
    auVar26 = vmaxps_avx(auVar26,auVar27);
    auVar26 = vmaxps_avx(auVar25,auVar26);
    auVar25 = vcmpps_avx(auVar17,auVar55,2);
    auVar26 = vcmpps_avx(auVar26,auVar54,5);
    auVar25 = vandps_avx(auVar26,auVar25);
    auVar92 = vandps_avx(auVar92,local_1b8);
    auVar26 = auVar92 & auVar25;
    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar26 >> 0x7f,0) != '\0') ||
          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar26 >> 0xbf,0) != '\0') ||
        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar26[0x1f] < '\0')
    {
      auVar92 = vandps_avx(auVar25,auVar92);
      uVar61 = vmovmskps_avx(auVar92);
      if (uVar61 != 0) {
        mask_stack[uVar59] = uVar61 & 0xff;
        BVar6 = (BBox1f)vmovlps_avx(auVar124);
        cu_stack[uVar59] = BVar6;
        BVar6 = (BBox1f)vmovlps_avx(auVar78);
        cv_stack[uVar59] = BVar6;
        uVar59 = (ulong)((int)uVar59 + 1);
      }
    }
  }
LAB_0123ac98:
  if ((int)uVar59 == 0) {
    uVar68 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar91._4_4_ = uVar68;
    auVar91._0_4_ = uVar68;
    auVar91._8_4_ = uVar68;
    auVar91._12_4_ = uVar68;
    auVar124 = vcmpps_avx(auVar202,auVar91,2);
    uVar58 = vmovmskps_avx(auVar124);
    uVar65 = uVar65 & uVar65 + 0xf & uVar58;
    goto LAB_012399d3;
  }
  uVar57 = (int)uVar59 - 1;
  uVar61 = mask_stack[uVar57];
  fVar95 = cu_stack[uVar57].lower;
  fVar67 = cu_stack[uVar57].upper;
  iVar33 = 0;
  for (uVar63 = (ulong)uVar61; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
    iVar33 = iVar33 + 1;
  }
  uVar61 = uVar61 - 1 & uVar61;
  if (uVar61 == 0) {
    uVar59 = (ulong)uVar57;
  }
  auVar78._8_8_ = 0;
  auVar78._0_4_ = cv_stack[uVar57].lower;
  auVar78._4_4_ = cv_stack[uVar57].upper;
  mask_stack[uVar57] = uVar61;
  fVar145 = (float)(iVar33 + 1) * 0.14285715;
  auVar124 = vfmadd231ss_fma(ZEXT416((uint)(fVar67 * (float)iVar33 * 0.14285715)),
                             ZEXT416((uint)fVar95),ZEXT416((uint)(1.0 - (float)iVar33 * 0.14285715))
                            );
  auVar314 = vfmadd231ss_fma(ZEXT416((uint)(fVar67 * fVar145)),ZEXT416((uint)fVar95),
                             ZEXT416((uint)(1.0 - fVar145)));
  fVar67 = auVar314._0_4_;
  auVar233._0_4_ = auVar124._0_4_;
  fVar95 = fVar67 - auVar233._0_4_;
  if (fVar95 < 0.16666667) {
    auVar323 = vshufps_avx(auVar78,auVar78,0x50);
    auVar115._8_4_ = 0x3f800000;
    auVar115._0_8_ = 0x3f8000003f800000;
    auVar115._12_4_ = 0x3f800000;
    auVar324 = vsubps_avx(auVar115,auVar323);
    fVar145 = auVar323._0_4_;
    auVar178._0_4_ = fVar145 * fVar167;
    fVar144 = auVar323._4_4_;
    auVar178._4_4_ = fVar144 * fVar184;
    fVar143 = auVar323._8_4_;
    auVar178._8_4_ = fVar143 * fVar167;
    fVar164 = auVar323._12_4_;
    auVar178._12_4_ = fVar164 * fVar184;
    auVar191._0_4_ = fVar145 * fVar218;
    auVar191._4_4_ = fVar144 * fVar237;
    auVar191._8_4_ = fVar143 * fVar218;
    auVar191._12_4_ = fVar164 * fVar237;
    auVar214._0_4_ = fVar145 * fVar239;
    auVar214._4_4_ = fVar144 * fVar235;
    auVar214._8_4_ = fVar143 * fVar239;
    auVar214._12_4_ = fVar164 * fVar235;
    auVar80._0_4_ = fVar145 * fVar185;
    auVar80._4_4_ = fVar144 * fVar200;
    auVar80._8_4_ = fVar143 * fVar185;
    auVar80._12_4_ = fVar164 * fVar200;
    auVar323 = vfmadd231ps_fma(auVar178,auVar324,auVar246);
    auVar18 = vfmadd231ps_fma(auVar191,auVar324,auVar268);
    auVar288 = vfmadd231ps_fma(auVar214,auVar324,auVar304);
    auVar324 = vfmadd231ps_fma(auVar80,auVar324,auVar317);
    auVar163._16_16_ = auVar323;
    auVar163._0_16_ = auVar323;
    auVar183._16_16_ = auVar18;
    auVar183._0_16_ = auVar18;
    auVar199._16_16_ = auVar288;
    auVar199._0_16_ = auVar288;
    auVar233._4_4_ = auVar233._0_4_;
    auVar233._8_4_ = auVar233._0_4_;
    auVar233._12_4_ = auVar233._0_4_;
    auVar233._20_4_ = fVar67;
    auVar233._16_4_ = fVar67;
    auVar233._24_4_ = fVar67;
    auVar233._28_4_ = fVar67;
    auVar92 = vsubps_avx(auVar183,auVar163);
    auVar18 = vfmadd213ps_fma(auVar92,auVar233,auVar163);
    auVar92 = vsubps_avx(auVar199,auVar183);
    auVar72 = vfmadd213ps_fma(auVar92,auVar233,auVar183);
    auVar323 = vsubps_avx(auVar324,auVar288);
    auVar94._16_16_ = auVar323;
    auVar94._0_16_ = auVar323;
    auVar323 = vfmadd213ps_fma(auVar94,auVar233,auVar199);
    auVar92 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar18));
    auVar324 = vfmadd213ps_fma(auVar92,auVar233,ZEXT1632(auVar18));
    auVar92 = vsubps_avx(ZEXT1632(auVar323),ZEXT1632(auVar72));
    auVar323 = vfmadd213ps_fma(auVar92,auVar233,ZEXT1632(auVar72));
    auVar92 = vsubps_avx(ZEXT1632(auVar323),ZEXT1632(auVar324));
    auVar74 = vfmadd231ps_fma(ZEXT1632(auVar324),auVar92,auVar233);
    fVar145 = fVar95 * 0.33333334;
    auVar226._0_8_ =
         CONCAT44(auVar74._4_4_ + fVar145 * auVar92._4_4_ * 3.0,
                  auVar74._0_4_ + fVar145 * auVar92._0_4_ * 3.0);
    auVar226._8_4_ = auVar74._8_4_ + fVar145 * auVar92._8_4_ * 3.0;
    auVar226._12_4_ = auVar74._12_4_ + fVar145 * auVar92._12_4_ * 3.0;
    auVar324 = vshufpd_avx(auVar74,auVar74,3);
    auVar18 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
    auVar323 = vsubps_avx(auVar324,auVar74);
    auVar288 = vsubps_avx(auVar18,(undefined1  [16])0x0);
    auVar81._0_4_ = auVar323._0_4_ + auVar288._0_4_;
    auVar81._4_4_ = auVar323._4_4_ + auVar288._4_4_;
    auVar81._8_4_ = auVar323._8_4_ + auVar288._8_4_;
    auVar81._12_4_ = auVar323._12_4_ + auVar288._12_4_;
    auVar323 = vshufps_avx(auVar74,auVar74,0xb1);
    auVar288 = vshufps_avx(auVar226,auVar226,0xb1);
    auVar318._4_4_ = auVar81._0_4_;
    auVar318._0_4_ = auVar81._0_4_;
    auVar318._8_4_ = auVar81._0_4_;
    auVar318._12_4_ = auVar81._0_4_;
    auVar72 = vshufps_avx(auVar81,auVar81,0x55);
    fVar144 = auVar72._0_4_;
    auVar82._0_4_ = fVar144 * auVar323._0_4_;
    fVar143 = auVar72._4_4_;
    auVar82._4_4_ = fVar143 * auVar323._4_4_;
    fVar164 = auVar72._8_4_;
    auVar82._8_4_ = fVar164 * auVar323._8_4_;
    fVar165 = auVar72._12_4_;
    auVar82._12_4_ = fVar165 * auVar323._12_4_;
    auVar192._0_4_ = fVar144 * auVar288._0_4_;
    auVar192._4_4_ = fVar143 * auVar288._4_4_;
    auVar192._8_4_ = fVar164 * auVar288._8_4_;
    auVar192._12_4_ = fVar165 * auVar288._12_4_;
    auVar73 = vfmadd231ps_fma(auVar82,auVar318,auVar74);
    auVar280 = vfmadd231ps_fma(auVar192,auVar318,auVar226);
    auVar288 = vshufps_avx(auVar73,auVar73,0xe8);
    auVar72 = vshufps_avx(auVar280,auVar280,0xe8);
    auVar323 = vcmpps_avx(auVar288,auVar72,1);
    uVar61 = vextractps_avx(auVar323,0);
    auVar75 = auVar280;
    if ((uVar61 & 1) == 0) {
      auVar75 = auVar73;
    }
    auVar156._0_4_ = fVar145 * auVar92._16_4_ * 3.0;
    auVar156._4_4_ = fVar145 * auVar92._20_4_ * 3.0;
    auVar156._8_4_ = fVar145 * auVar92._24_4_ * 3.0;
    auVar156._12_4_ = fVar145 * 0.0;
    auVar103 = vsubps_avx((undefined1  [16])0x0,auVar156);
    auVar157 = vshufps_avx(auVar103,auVar103,0xb1);
    auVar76 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
    auVar227._0_4_ = fVar144 * auVar157._0_4_;
    auVar227._4_4_ = fVar143 * auVar157._4_4_;
    auVar227._8_4_ = fVar164 * auVar157._8_4_;
    auVar227._12_4_ = fVar165 * auVar157._12_4_;
    auVar247._0_4_ = auVar76._0_4_ * fVar144;
    auVar247._4_4_ = auVar76._4_4_ * fVar143;
    auVar247._8_4_ = auVar76._8_4_ * fVar164;
    auVar247._12_4_ = auVar76._12_4_ * fVar165;
    auVar104 = vfmadd231ps_fma(auVar227,auVar318,auVar103);
    auVar105 = vfmadd231ps_fma(auVar247,(undefined1  [16])0x0,auVar318);
    auVar76 = vshufps_avx(auVar104,auVar104,0xe8);
    auVar77 = vshufps_avx(auVar105,auVar105,0xe8);
    auVar157 = vcmpps_avx(auVar76,auVar77,1);
    uVar61 = vextractps_avx(auVar157,0);
    auVar106 = auVar105;
    if ((uVar61 & 1) == 0) {
      auVar106 = auVar104;
    }
    auVar75 = vmaxss_avx(auVar106,auVar75);
    auVar288 = vminps_avx(auVar288,auVar72);
    auVar72 = vminps_avx(auVar76,auVar77);
    auVar72 = vminps_avx(auVar288,auVar72);
    auVar323 = vshufps_avx(auVar323,auVar323,0x55);
    auVar323 = vblendps_avx(auVar323,auVar157,2);
    auVar157 = vpslld_avx(auVar323,0x1f);
    auVar323 = vshufpd_avx(auVar280,auVar280,1);
    auVar323 = vinsertps_avx(auVar323,auVar105,0x9c);
    auVar288 = vshufpd_avx(auVar73,auVar73,1);
    auVar288 = vinsertps_avx(auVar288,auVar104,0x9c);
    auVar323 = vblendvps_avx(auVar288,auVar323,auVar157);
    auVar288 = vmovshdup_avx(auVar323);
    auVar323 = vmaxss_avx(auVar288,auVar323);
    fVar164 = auVar72._0_4_;
    auVar288 = vmovshdup_avx(auVar72);
    fVar143 = auVar323._0_4_;
    fVar145 = auVar288._0_4_;
    fVar144 = auVar75._0_4_;
    if (((0.0001 <= fVar164) || (fVar143 <= -0.0001)) && (0.0001 <= fVar145 || fVar143 <= -0.0001))
    goto code_r0x0123afa4;
    goto LAB_0123afca;
  }
  auVar124 = vinsertps_avx(auVar124,auVar314,0x10);
  goto LAB_0123a6e5;
code_r0x0123afa4:
  auVar288 = vcmpps_avx(auVar288,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar73 = vcmpps_avx(auVar72,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar288 = vandps_avx(auVar73,auVar288);
  if (fVar144 <= -0.0001 || (auVar288 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_0123ac98;
LAB_0123afca:
  auVar73 = vcmpps_avx(auVar72,_DAT_01f45a50,1);
  auVar280 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar288 = vcmpss_avx(auVar75,ZEXT816(0) << 0x20,1);
  auVar116._8_4_ = 0x3f800000;
  auVar116._0_8_ = 0x3f8000003f800000;
  auVar116._12_4_ = 0x3f800000;
  auVar137._8_4_ = 0xbf800000;
  auVar137._0_8_ = 0xbf800000bf800000;
  auVar137._12_4_ = 0xbf800000;
  auVar288 = vblendvps_avx(auVar116,auVar137,auVar288);
  auVar73 = vblendvps_avx(auVar116,auVar137,auVar73);
  fVar166 = auVar73._0_4_;
  fVar165 = auVar288._0_4_;
  auVar288 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar166 == fVar165) && (!NAN(fVar166) && !NAN(fVar165))) {
    auVar288 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar166 == fVar165) && (!NAN(fVar166) && !NAN(fVar165))) {
    auVar280 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar73 = vmovshdup_avx(auVar73);
  fVar234 = auVar73._0_4_;
  if ((fVar166 != fVar234) || (NAN(fVar166) || NAN(fVar234))) {
    if ((fVar145 != fVar164) || (NAN(fVar145) || NAN(fVar164))) {
      auVar158._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
      auVar158._8_4_ = auVar72._8_4_ ^ 0x80000000;
      auVar158._12_4_ = auVar72._12_4_ ^ 0x80000000;
      auVar159._0_4_ = -fVar164 / (fVar145 - fVar164);
      auVar159._4_12_ = auVar158._4_12_;
      auVar72 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar159._0_4_)),auVar159,ZEXT416(0));
      auVar73 = auVar72;
    }
    else {
      auVar72 = ZEXT816(0) << 0x20;
      if ((fVar164 != 0.0) || (auVar73 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar164))) {
        auVar72 = SUB6416(ZEXT464(0x7f800000),0);
        auVar73 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar288 = vminss_avx(auVar288,auVar72);
    auVar280 = vmaxss_avx(auVar73,auVar280);
  }
  auVar323 = vcmpss_avx(auVar323,ZEXT416(0),1);
  auVar117._8_4_ = 0x3f800000;
  auVar117._0_8_ = 0x3f8000003f800000;
  auVar117._12_4_ = 0x3f800000;
  auVar138._8_4_ = 0xbf800000;
  auVar138._0_8_ = 0xbf800000bf800000;
  auVar138._12_4_ = 0xbf800000;
  auVar323 = vblendvps_avx(auVar117,auVar138,auVar323);
  fVar145 = auVar323._0_4_;
  if ((fVar165 != fVar145) || (NAN(fVar165) || NAN(fVar145))) {
    if ((fVar143 != fVar144) || (NAN(fVar143) || NAN(fVar144))) {
      auVar83._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
      auVar83._8_4_ = auVar75._8_4_ ^ 0x80000000;
      auVar83._12_4_ = auVar75._12_4_ ^ 0x80000000;
      auVar160._0_4_ = -fVar144 / (fVar143 - fVar144);
      auVar160._4_12_ = auVar83._4_12_;
      auVar323 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar160._0_4_)),auVar160,ZEXT416(0));
      auVar72 = auVar323;
    }
    else {
      auVar323 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar144 != 0.0) || (auVar72 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar144))) {
        auVar323 = SUB6416(ZEXT464(0xff800000),0);
        auVar72 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar288 = vminss_avx(auVar288,auVar72);
    auVar280 = vmaxss_avx(auVar323,auVar280);
  }
  if ((fVar234 != fVar145) || (NAN(fVar234) || NAN(fVar145))) {
    auVar288 = vminss_avx(auVar288,SUB6416(ZEXT464(0x3f800000),0));
    auVar280 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar280);
  }
  auVar323 = vmaxss_avx(ZEXT816(0) << 0x40,auVar288);
  auVar288 = vminss_avx(auVar280,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar288._0_4_ < auVar323._0_4_) goto LAB_0123ac98;
  auVar323 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar323._0_4_ + -0.1)));
  auVar288 = vminss_avx(ZEXT416((uint)(auVar288._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar179._0_8_ = auVar74._0_8_;
  auVar179._8_8_ = auVar179._0_8_;
  auVar257._8_8_ = auVar226._0_8_;
  auVar257._0_8_ = auVar226._0_8_;
  auVar269._8_8_ = auVar103._0_8_;
  auVar269._0_8_ = auVar103._0_8_;
  auVar72 = vshufpd_avx(auVar226,auVar226,3);
  auVar73 = vshufpd_avx(auVar103,auVar103,3);
  auVar280 = vshufps_avx(auVar323,auVar288,0);
  auVar84._8_4_ = 0x3f800000;
  auVar84._0_8_ = 0x3f8000003f800000;
  auVar84._12_4_ = 0x3f800000;
  auVar74 = vsubps_avx(auVar84,auVar280);
  local_4d8 = auVar324._0_4_;
  fStack_4d4 = auVar324._4_4_;
  fStack_4d0 = auVar324._8_4_;
  fStack_4cc = auVar324._12_4_;
  fVar145 = auVar280._0_4_;
  auVar85._0_4_ = fVar145 * local_4d8;
  fVar144 = auVar280._4_4_;
  auVar85._4_4_ = fVar144 * fStack_4d4;
  fVar143 = auVar280._8_4_;
  auVar85._8_4_ = fVar143 * fStack_4d0;
  fVar164 = auVar280._12_4_;
  auVar85._12_4_ = fVar164 * fStack_4cc;
  auVar215._0_4_ = fVar145 * auVar72._0_4_;
  auVar215._4_4_ = fVar144 * auVar72._4_4_;
  auVar215._8_4_ = fVar143 * auVar72._8_4_;
  auVar215._12_4_ = fVar164 * auVar72._12_4_;
  auVar228._0_4_ = fVar145 * auVar73._0_4_;
  auVar228._4_4_ = fVar144 * auVar73._4_4_;
  auVar228._8_4_ = fVar143 * auVar73._8_4_;
  auVar228._12_4_ = fVar164 * auVar73._12_4_;
  local_538 = auVar18._0_4_;
  fStack_534 = auVar18._4_4_;
  fStack_530 = auVar18._8_4_;
  fStack_52c = auVar18._12_4_;
  auVar248._0_4_ = fVar145 * local_538;
  auVar248._4_4_ = fVar144 * fStack_534;
  auVar248._8_4_ = fVar143 * fStack_530;
  auVar248._12_4_ = fVar164 * fStack_52c;
  auVar72 = vfmadd231ps_fma(auVar85,auVar74,auVar179);
  auVar73 = vfmadd231ps_fma(auVar215,auVar74,auVar257);
  auVar280 = vfmadd231ps_fma(auVar228,auVar74,auVar269);
  auVar74 = vfmadd231ps_fma(auVar248,auVar74,ZEXT816(0));
  auVar324 = vmovshdup_avx(auVar78);
  auVar77 = vfmadd231ss_fma(ZEXT416((uint)(auVar324._0_4_ * auVar323._0_4_)),auVar78,
                            ZEXT416((uint)(1.0 - auVar323._0_4_)));
  auVar103 = vfmadd231ss_fma(ZEXT416((uint)(auVar324._0_4_ * auVar288._0_4_)),auVar78,
                             ZEXT416((uint)(1.0 - auVar288._0_4_)));
  fVar145 = 1.0 / fVar95;
  auVar323 = vsubps_avx(auVar73,auVar72);
  auVar258._0_4_ = auVar323._0_4_ * 3.0;
  auVar258._4_4_ = auVar323._4_4_ * 3.0;
  auVar258._8_4_ = auVar323._8_4_ * 3.0;
  auVar258._12_4_ = auVar323._12_4_ * 3.0;
  auVar323 = vsubps_avx(auVar280,auVar73);
  auVar270._0_4_ = auVar323._0_4_ * 3.0;
  auVar270._4_4_ = auVar323._4_4_ * 3.0;
  auVar270._8_4_ = auVar323._8_4_ * 3.0;
  auVar270._12_4_ = auVar323._12_4_ * 3.0;
  auVar323 = vsubps_avx(auVar74,auVar280);
  auVar281._0_4_ = auVar323._0_4_ * 3.0;
  auVar281._4_4_ = auVar323._4_4_ * 3.0;
  auVar281._8_4_ = auVar323._8_4_ * 3.0;
  auVar281._12_4_ = auVar323._12_4_ * 3.0;
  auVar324 = vminps_avx(auVar270,auVar281);
  auVar323 = vmaxps_avx(auVar270,auVar281);
  auVar324 = vminps_avx(auVar258,auVar324);
  auVar323 = vmaxps_avx(auVar258,auVar323);
  auVar78 = vshufpd_avx(auVar324,auVar324,3);
  auVar18 = vshufpd_avx(auVar323,auVar323,3);
  auVar324 = vminps_avx(auVar324,auVar78);
  auVar323 = vmaxps_avx(auVar323,auVar18);
  auVar271._0_4_ = auVar324._0_4_ * fVar145;
  auVar271._4_4_ = auVar324._4_4_ * fVar145;
  auVar271._8_4_ = auVar324._8_4_ * fVar145;
  auVar271._12_4_ = auVar324._12_4_ * fVar145;
  auVar259._0_4_ = auVar323._0_4_ * fVar145;
  auVar259._4_4_ = auVar323._4_4_ * fVar145;
  auVar259._8_4_ = auVar323._8_4_ * fVar145;
  auVar259._12_4_ = auVar323._12_4_ * fVar145;
  fVar145 = 1.0 / (auVar103._0_4_ - auVar77._0_4_);
  auVar323 = vshufpd_avx(auVar72,auVar72,3);
  auVar324 = vshufpd_avx(auVar73,auVar73,3);
  auVar78 = vshufpd_avx(auVar280,auVar280,3);
  auVar18 = vshufpd_avx(auVar74,auVar74,3);
  auVar323 = vsubps_avx(auVar323,auVar72);
  auVar288 = vsubps_avx(auVar324,auVar73);
  auVar72 = vsubps_avx(auVar78,auVar280);
  auVar18 = vsubps_avx(auVar18,auVar74);
  auVar324 = vminps_avx(auVar323,auVar288);
  auVar323 = vmaxps_avx(auVar323,auVar288);
  auVar78 = vminps_avx(auVar72,auVar18);
  auVar78 = vminps_avx(auVar324,auVar78);
  auVar324 = vmaxps_avx(auVar72,auVar18);
  auVar323 = vmaxps_avx(auVar323,auVar324);
  auVar305._0_4_ = fVar145 * auVar78._0_4_;
  auVar305._4_4_ = fVar145 * auVar78._4_4_;
  auVar305._8_4_ = fVar145 * auVar78._8_4_;
  auVar305._12_4_ = fVar145 * auVar78._12_4_;
  auVar289._0_4_ = fVar145 * auVar323._0_4_;
  auVar289._4_4_ = fVar145 * auVar323._4_4_;
  auVar289._8_4_ = fVar145 * auVar323._8_4_;
  auVar289._12_4_ = fVar145 * auVar323._12_4_;
  auVar18 = vinsertps_avx(auVar124,auVar77,0x10);
  auVar288 = vinsertps_avx(auVar314,auVar103,0x10);
  auVar282._0_4_ = (auVar18._0_4_ + auVar288._0_4_) * 0.5;
  auVar282._4_4_ = (auVar18._4_4_ + auVar288._4_4_) * 0.5;
  auVar282._8_4_ = (auVar18._8_4_ + auVar288._8_4_) * 0.5;
  auVar282._12_4_ = (auVar18._12_4_ + auVar288._12_4_) * 0.5;
  auVar86._4_4_ = auVar282._0_4_;
  auVar86._0_4_ = auVar282._0_4_;
  auVar86._8_4_ = auVar282._0_4_;
  auVar86._12_4_ = auVar282._0_4_;
  auVar323 = vfmadd213ps_fma(auVar16,auVar86,auVar21);
  auVar324 = vfmadd213ps_fma(auVar20,auVar86,auVar173);
  auVar78 = vfmadd213ps_fma(auVar131,auVar86,auVar23);
  auVar314 = vsubps_avx(auVar324,auVar323);
  auVar323 = vfmadd213ps_fma(auVar314,auVar86,auVar323);
  auVar314 = vsubps_avx(auVar78,auVar324);
  auVar314 = vfmadd213ps_fma(auVar314,auVar86,auVar324);
  auVar314 = vsubps_avx(auVar314,auVar323);
  auVar323 = vfmadd231ps_fma(auVar323,auVar314,auVar86);
  auVar87._0_8_ = CONCAT44(auVar314._4_4_ * 3.0,auVar314._0_4_ * 3.0);
  auVar87._8_4_ = auVar314._8_4_ * 3.0;
  auVar87._12_4_ = auVar314._12_4_ * 3.0;
  auVar319._8_8_ = auVar323._0_8_;
  auVar319._0_8_ = auVar323._0_8_;
  auVar314 = vshufpd_avx(auVar323,auVar323,3);
  auVar323 = vshufps_avx(auVar282,auVar282,0x55);
  auVar73 = vsubps_avx(auVar314,auVar319);
  auVar74 = vfmadd231ps_fma(auVar319,auVar323,auVar73);
  auVar328._8_8_ = auVar87._0_8_;
  auVar328._0_8_ = auVar87._0_8_;
  auVar314 = vshufpd_avx(auVar87,auVar87,3);
  auVar314 = vsubps_avx(auVar314,auVar328);
  auVar280 = vfmadd213ps_fma(auVar314,auVar323,auVar328);
  auVar323 = vmovshdup_avx(auVar280);
  auVar329._0_8_ = auVar323._0_8_ ^ 0x8000000080000000;
  auVar329._8_4_ = auVar323._8_4_ ^ 0x80000000;
  auVar329._12_4_ = auVar323._12_4_ ^ 0x80000000;
  auVar324 = vmovshdup_avx(auVar73);
  auVar314 = vunpcklps_avx(auVar324,auVar329);
  auVar78 = vshufps_avx(auVar314,auVar329,4);
  auVar72 = vshufps_avx(auVar282,auVar282,0x54);
  auVar161._0_8_ = auVar73._0_8_ ^ 0x8000000080000000;
  auVar161._8_4_ = auVar73._8_4_ ^ 0x80000000;
  auVar161._12_4_ = auVar73._12_4_ ^ 0x80000000;
  auVar314 = vmovlhps_avx(auVar161,auVar280);
  auVar314 = vshufps_avx(auVar314,auVar280,8);
  auVar323 = vfmsub231ss_fma(ZEXT416((uint)(auVar73._0_4_ * auVar323._0_4_)),auVar324,auVar280);
  uVar68 = auVar323._0_4_;
  auVar88._4_4_ = uVar68;
  auVar88._0_4_ = uVar68;
  auVar88._8_4_ = uVar68;
  auVar88._12_4_ = uVar68;
  auVar323 = vdivps_avx(auVar78,auVar88);
  auVar324 = vdivps_avx(auVar314,auVar88);
  fVar143 = auVar74._0_4_;
  fVar145 = auVar323._0_4_;
  auVar314 = vshufps_avx(auVar74,auVar74,0x55);
  fVar144 = auVar324._0_4_;
  auVar89._0_4_ = fVar143 * fVar145 + auVar314._0_4_ * fVar144;
  auVar89._4_4_ = fVar143 * auVar323._4_4_ + auVar314._4_4_ * auVar324._4_4_;
  auVar89._8_4_ = fVar143 * auVar323._8_4_ + auVar314._8_4_ * auVar324._8_4_;
  auVar89._12_4_ = fVar143 * auVar323._12_4_ + auVar314._12_4_ * auVar324._12_4_;
  auVar76 = vsubps_avx(auVar72,auVar89);
  auVar72 = vmovshdup_avx(auVar323);
  auVar314 = vinsertps_avx(auVar271,auVar305,0x1c);
  auVar193._0_4_ = auVar72._0_4_ * auVar314._0_4_;
  auVar193._4_4_ = auVar72._4_4_ * auVar314._4_4_;
  auVar193._8_4_ = auVar72._8_4_ * auVar314._8_4_;
  auVar193._12_4_ = auVar72._12_4_ * auVar314._12_4_;
  auVar78 = vinsertps_avx(auVar259,auVar289,0x1c);
  auVar118._0_4_ = auVar78._0_4_ * auVar72._0_4_;
  auVar118._4_4_ = auVar78._4_4_ * auVar72._4_4_;
  auVar118._8_4_ = auVar78._8_4_ * auVar72._8_4_;
  auVar118._12_4_ = auVar78._12_4_ * auVar72._12_4_;
  auVar74 = vminps_avx(auVar193,auVar118);
  auVar280 = vmaxps_avx(auVar118,auVar193);
  auVar72 = vinsertps_avx(auVar305,auVar271,0x4c);
  auVar75 = vmovshdup_avx(auVar324);
  auVar73 = vinsertps_avx(auVar289,auVar259,0x4c);
  auVar290._0_4_ = auVar75._0_4_ * auVar72._0_4_;
  auVar290._4_4_ = auVar75._4_4_ * auVar72._4_4_;
  auVar290._8_4_ = auVar75._8_4_ * auVar72._8_4_;
  auVar290._12_4_ = auVar75._12_4_ * auVar72._12_4_;
  auVar272._0_4_ = auVar75._0_4_ * auVar73._0_4_;
  auVar272._4_4_ = auVar75._4_4_ * auVar73._4_4_;
  auVar272._8_4_ = auVar75._8_4_ * auVar73._8_4_;
  auVar272._12_4_ = auVar75._12_4_ * auVar73._12_4_;
  auVar75 = vminps_avx(auVar290,auVar272);
  auVar306._0_4_ = auVar74._0_4_ + auVar75._0_4_;
  auVar306._4_4_ = auVar74._4_4_ + auVar75._4_4_;
  auVar306._8_4_ = auVar74._8_4_ + auVar75._8_4_;
  auVar306._12_4_ = auVar74._12_4_ + auVar75._12_4_;
  auVar74 = vmaxps_avx(auVar272,auVar290);
  auVar119._0_4_ = auVar74._0_4_ + auVar280._0_4_;
  auVar119._4_4_ = auVar74._4_4_ + auVar280._4_4_;
  auVar119._8_4_ = auVar74._8_4_ + auVar280._8_4_;
  auVar119._12_4_ = auVar74._12_4_ + auVar280._12_4_;
  auVar273._8_8_ = 0x3f80000000000000;
  auVar273._0_8_ = 0x3f80000000000000;
  auVar280 = vsubps_avx(auVar273,auVar119);
  auVar74 = vsubps_avx(auVar273,auVar306);
  auVar75 = vsubps_avx(auVar18,auVar282);
  auVar157 = vsubps_avx(auVar288,auVar282);
  auVar139._0_4_ = fVar145 * auVar314._0_4_;
  auVar139._4_4_ = fVar145 * auVar314._4_4_;
  auVar139._8_4_ = fVar145 * auVar314._8_4_;
  auVar139._12_4_ = fVar145 * auVar314._12_4_;
  auVar307._0_4_ = fVar145 * auVar78._0_4_;
  auVar307._4_4_ = fVar145 * auVar78._4_4_;
  auVar307._8_4_ = fVar145 * auVar78._8_4_;
  auVar307._12_4_ = fVar145 * auVar78._12_4_;
  auVar78 = vminps_avx(auVar139,auVar307);
  auVar314 = vmaxps_avx(auVar307,auVar139);
  auVar194._0_4_ = fVar144 * auVar72._0_4_;
  auVar194._4_4_ = fVar144 * auVar72._4_4_;
  auVar194._8_4_ = fVar144 * auVar72._8_4_;
  auVar194._12_4_ = fVar144 * auVar72._12_4_;
  auVar260._0_4_ = fVar144 * auVar73._0_4_;
  auVar260._4_4_ = fVar144 * auVar73._4_4_;
  auVar260._8_4_ = fVar144 * auVar73._8_4_;
  auVar260._12_4_ = fVar144 * auVar73._12_4_;
  auVar72 = vminps_avx(auVar194,auVar260);
  auVar308._0_4_ = auVar78._0_4_ + auVar72._0_4_;
  auVar308._4_4_ = auVar78._4_4_ + auVar72._4_4_;
  auVar308._8_4_ = auVar78._8_4_ + auVar72._8_4_;
  auVar308._12_4_ = auVar78._12_4_ + auVar72._12_4_;
  fVar234 = auVar75._0_4_;
  auVar320._0_4_ = fVar234 * auVar280._0_4_;
  fVar236 = auVar75._4_4_;
  auVar320._4_4_ = fVar236 * auVar280._4_4_;
  fVar238 = auVar75._8_4_;
  auVar320._8_4_ = fVar238 * auVar280._8_4_;
  fVar240 = auVar75._12_4_;
  auVar320._12_4_ = fVar240 * auVar280._12_4_;
  auVar78 = vmaxps_avx(auVar260,auVar194);
  auVar261._0_4_ = fVar234 * auVar74._0_4_;
  auVar261._4_4_ = fVar236 * auVar74._4_4_;
  auVar261._8_4_ = fVar238 * auVar74._8_4_;
  auVar261._12_4_ = fVar240 * auVar74._12_4_;
  fVar143 = auVar157._0_4_;
  auVar120._0_4_ = fVar143 * auVar280._0_4_;
  fVar164 = auVar157._4_4_;
  auVar120._4_4_ = fVar164 * auVar280._4_4_;
  fVar165 = auVar157._8_4_;
  auVar120._8_4_ = fVar165 * auVar280._8_4_;
  fVar166 = auVar157._12_4_;
  auVar120._12_4_ = fVar166 * auVar280._12_4_;
  auVar274._0_4_ = fVar143 * auVar74._0_4_;
  auVar274._4_4_ = fVar164 * auVar74._4_4_;
  auVar274._8_4_ = fVar165 * auVar74._8_4_;
  auVar274._12_4_ = fVar166 * auVar74._12_4_;
  auVar140._0_4_ = auVar314._0_4_ + auVar78._0_4_;
  auVar140._4_4_ = auVar314._4_4_ + auVar78._4_4_;
  auVar140._8_4_ = auVar314._8_4_ + auVar78._8_4_;
  auVar140._12_4_ = auVar314._12_4_ + auVar78._12_4_;
  auVar195._8_8_ = 0x3f800000;
  auVar195._0_8_ = 0x3f800000;
  auVar314 = vsubps_avx(auVar195,auVar140);
  auVar78 = vsubps_avx(auVar195,auVar308);
  auVar309._0_4_ = fVar234 * auVar314._0_4_;
  auVar309._4_4_ = fVar236 * auVar314._4_4_;
  auVar309._8_4_ = fVar238 * auVar314._8_4_;
  auVar309._12_4_ = fVar240 * auVar314._12_4_;
  auVar291._0_4_ = fVar234 * auVar78._0_4_;
  auVar291._4_4_ = fVar236 * auVar78._4_4_;
  auVar291._8_4_ = fVar238 * auVar78._8_4_;
  auVar291._12_4_ = fVar240 * auVar78._12_4_;
  auVar141._0_4_ = fVar143 * auVar314._0_4_;
  auVar141._4_4_ = fVar164 * auVar314._4_4_;
  auVar141._8_4_ = fVar165 * auVar314._8_4_;
  auVar141._12_4_ = fVar166 * auVar314._12_4_;
  auVar196._0_4_ = fVar143 * auVar78._0_4_;
  auVar196._4_4_ = fVar164 * auVar78._4_4_;
  auVar196._8_4_ = fVar165 * auVar78._8_4_;
  auVar196._12_4_ = fVar166 * auVar78._12_4_;
  auVar314 = vminps_avx(auVar309,auVar291);
  auVar78 = vminps_avx(auVar141,auVar196);
  auVar314 = vminps_avx(auVar314,auVar78);
  auVar78 = vmaxps_avx(auVar291,auVar309);
  auVar72 = vmaxps_avx(auVar196,auVar141);
  auVar73 = vminps_avx(auVar320,auVar261);
  auVar280 = vminps_avx(auVar120,auVar274);
  auVar73 = vminps_avx(auVar73,auVar280);
  auVar314 = vhaddps_avx(auVar314,auVar73);
  auVar78 = vmaxps_avx(auVar72,auVar78);
  auVar72 = vmaxps_avx(auVar261,auVar320);
  auVar73 = vmaxps_avx(auVar274,auVar120);
  auVar72 = vmaxps_avx(auVar73,auVar72);
  auVar78 = vhaddps_avx(auVar78,auVar72);
  auVar314 = vshufps_avx(auVar314,auVar314,0xe8);
  auVar78 = vshufps_avx(auVar78,auVar78,0xe8);
  auVar275._0_4_ = auVar76._0_4_ + auVar314._0_4_;
  auVar275._4_4_ = auVar76._4_4_ + auVar314._4_4_;
  auVar275._8_4_ = auVar76._8_4_ + auVar314._8_4_;
  auVar275._12_4_ = auVar76._12_4_ + auVar314._12_4_;
  auVar262._0_4_ = auVar76._0_4_ + auVar78._0_4_;
  auVar262._4_4_ = auVar76._4_4_ + auVar78._4_4_;
  auVar262._8_4_ = auVar76._8_4_ + auVar78._8_4_;
  auVar262._12_4_ = auVar76._12_4_ + auVar78._12_4_;
  auVar314 = vmaxps_avx(auVar18,auVar275);
  auVar78 = vminps_avx(auVar262,auVar288);
  auVar314 = vcmpps_avx(auVar78,auVar314,1);
  auVar314 = vshufps_avx(auVar314,auVar314,0x50);
  if ((auVar314 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar314[0xf] < '\0')
  goto LAB_0123ac98;
  bVar60 = 0;
  if ((auVar233._0_4_ < auVar275._0_4_) && (bVar60 = 0, auVar262._0_4_ < auVar288._0_4_)) {
    auVar78 = vmovshdup_avx(auVar275);
    auVar314 = vcmpps_avx(auVar262,auVar288,1);
    bVar60 = auVar314[4] & auVar77._0_4_ < auVar78._0_4_;
  }
  p03.field_0.i[0] = auVar19._0_4_;
  p03.field_0.i[1] = auVar19._4_4_;
  p03.field_0.i[2] = auVar19._8_4_;
  p03.field_0.i[3] = auVar19._12_4_;
  if (((3 < (uint)uVar59 || fVar95 < 0.001) | bVar60) == 1) {
    lVar62 = 0xc9;
    do {
      lVar62 = lVar62 + -1;
      if (lVar62 == 0) goto LAB_0123ac98;
      fVar164 = auVar76._0_4_;
      fVar143 = 1.0 - fVar164;
      fVar95 = fVar143 * fVar143 * fVar143;
      fVar67 = fVar164 * 3.0 * fVar143 * fVar143;
      fVar143 = fVar143 * fVar164 * fVar164 * 3.0;
      auVar180._4_4_ = fVar95;
      auVar180._0_4_ = fVar95;
      auVar180._8_4_ = fVar95;
      auVar180._12_4_ = fVar95;
      auVar142._4_4_ = fVar67;
      auVar142._0_4_ = fVar67;
      auVar142._8_4_ = fVar67;
      auVar142._12_4_ = fVar67;
      auVar121._4_4_ = fVar143;
      auVar121._0_4_ = fVar143;
      auVar121._8_4_ = fVar143;
      auVar121._12_4_ = fVar143;
      fVar164 = fVar164 * fVar164 * fVar164;
      auVar197._0_4_ = p03.field_0.v[0] * fVar164;
      auVar197._4_4_ = p03.field_0.v[1] * fVar164;
      auVar197._8_4_ = p03.field_0.v[2] * fVar164;
      auVar197._12_4_ = p03.field_0.v[3] * fVar164;
      auVar124 = vfmadd231ps_fma(auVar197,auVar23,auVar121);
      auVar124 = vfmadd231ps_fma(auVar124,auVar173,auVar142);
      auVar124 = vfmadd231ps_fma(auVar124,auVar21,auVar180);
      auVar122._8_8_ = auVar124._0_8_;
      auVar122._0_8_ = auVar124._0_8_;
      auVar124 = vshufpd_avx(auVar124,auVar124,3);
      auVar314 = vshufps_avx(auVar76,auVar76,0x55);
      auVar124 = vsubps_avx(auVar124,auVar122);
      auVar314 = vfmadd213ps_fma(auVar124,auVar314,auVar122);
      fVar95 = auVar314._0_4_;
      auVar124 = vshufps_avx(auVar314,auVar314,0x55);
      auVar123._0_4_ = fVar145 * fVar95 + fVar144 * auVar124._0_4_;
      auVar123._4_4_ = auVar323._4_4_ * fVar95 + auVar324._4_4_ * auVar124._4_4_;
      auVar123._8_4_ = auVar323._8_4_ * fVar95 + auVar324._8_4_ * auVar124._8_4_;
      auVar123._12_4_ = auVar323._12_4_ * fVar95 + auVar324._12_4_ * auVar124._12_4_;
      auVar76 = vsubps_avx(auVar76,auVar123);
      auVar124 = vandps_avx(auVar69,auVar314);
      auVar314 = vshufps_avx(auVar124,auVar124,0xf5);
      auVar124 = vmaxss_avx(auVar314,auVar124);
    } while (fVar97 <= auVar124._0_4_);
    local_218 = auVar76._0_4_;
    if ((0.0 <= local_218) && (local_218 <= 1.0)) {
      auVar124 = vmovshdup_avx(auVar76);
      fVar95 = auVar124._0_4_;
      if ((0.0 <= fVar95) && (fVar95 <= 1.0)) {
        auVar124 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                 ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
        auVar72 = vinsertps_avx(auVar124,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
        auVar124 = vdpps_avx(auVar72,auVar22,0x7f);
        auVar314 = vdpps_avx(auVar72,auVar170,0x7f);
        auVar323 = vdpps_avx(auVar72,auVar267,0x7f);
        auVar324 = vdpps_avx(auVar72,auVar24,0x7f);
        auVar78 = vdpps_avx(auVar72,auVar108,0x7f);
        auVar18 = vdpps_avx(auVar72,auVar71,0x7f);
        auVar288 = vdpps_avx(auVar72,auVar101,0x7f);
        auVar72 = vdpps_avx(auVar72,auVar102,0x7f);
        fVar67 = 1.0 - fVar95;
        auVar124 = vfmadd231ss_fma(ZEXT416((uint)(fVar95 * auVar78._0_4_)),ZEXT416((uint)fVar67),
                                   auVar124);
        auVar314 = vfmadd231ss_fma(ZEXT416((uint)(auVar18._0_4_ * fVar95)),ZEXT416((uint)fVar67),
                                   auVar314);
        auVar323 = vfmadd231ss_fma(ZEXT416((uint)(auVar288._0_4_ * fVar95)),ZEXT416((uint)fVar67),
                                   auVar323);
        auVar324 = vfmadd231ss_fma(ZEXT416((uint)(fVar95 * auVar72._0_4_)),ZEXT416((uint)fVar67),
                                   auVar324);
        fVar143 = 1.0 - local_218;
        fVar67 = fVar143 * local_218 * local_218 * 3.0;
        fVar165 = local_218 * local_218 * local_218;
        auVar323 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * auVar324._0_4_)),ZEXT416((uint)fVar67),
                                   auVar323);
        fVar145 = local_218 * 3.0 * fVar143 * fVar143;
        auVar314 = vfmadd231ss_fma(auVar323,ZEXT416((uint)fVar145),auVar314);
        fVar144 = fVar143 * fVar143 * fVar143;
        auVar124 = vfmadd231ss_fma(auVar314,ZEXT416((uint)fVar144),auVar124);
        fVar164 = auVar124._0_4_;
        if (((fVar66 <= fVar164) && (fVar166 = *(float *)(ray + k * 4 + 0x80), fVar164 <= fVar166))
           && (pGVar9 = (context->scene->geometries).items[uVar58].ptr,
              (pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
          auVar124 = vshufps_avx(auVar76,auVar76,0x55);
          auVar263._8_4_ = 0x3f800000;
          auVar263._0_8_ = 0x3f8000003f800000;
          auVar263._12_4_ = 0x3f800000;
          auVar314 = vsubps_avx(auVar263,auVar124);
          local_408 = auVar169._0_4_;
          fStack_404 = auVar169._4_4_;
          fStack_400 = auVar169._8_4_;
          fStack_3fc = auVar169._12_4_;
          fVar234 = auVar124._0_4_;
          auVar276._0_4_ = fVar234 * local_408;
          fVar236 = auVar124._4_4_;
          auVar276._4_4_ = fVar236 * fStack_404;
          fVar238 = auVar124._8_4_;
          auVar276._8_4_ = fVar238 * fStack_400;
          fVar240 = auVar124._12_4_;
          auVar276._12_4_ = fVar240 * fStack_3fc;
          local_418 = auVar186._0_4_;
          fStack_414 = auVar186._4_4_;
          fStack_410 = auVar186._8_4_;
          fStack_40c = auVar186._12_4_;
          auVar283._0_4_ = fVar234 * local_418;
          auVar283._4_4_ = fVar236 * fStack_414;
          auVar283._8_4_ = fVar238 * fStack_410;
          auVar283._12_4_ = fVar240 * fStack_40c;
          local_4a8 = auVar201._0_4_;
          fStack_4a4 = auVar201._4_4_;
          fStack_4a0 = auVar201._8_4_;
          fStack_49c = auVar201._12_4_;
          auVar292._0_4_ = fVar234 * local_4a8;
          auVar292._4_4_ = fVar236 * fStack_4a4;
          auVar292._8_4_ = fVar238 * fStack_4a0;
          auVar292._12_4_ = fVar240 * fStack_49c;
          local_4b8 = auVar219._0_4_;
          fStack_4b4 = auVar219._4_4_;
          fStack_4b0 = auVar219._8_4_;
          fStack_4ac = auVar219._12_4_;
          auVar310._0_4_ = fVar234 * local_4b8;
          auVar310._4_4_ = fVar236 * fStack_4b4;
          auVar310._8_4_ = fVar238 * fStack_4b0;
          auVar310._12_4_ = fVar240 * fStack_4ac;
          auVar323 = vfmadd231ps_fma(auVar276,auVar314,auVar130);
          auVar324 = vfmadd231ps_fma(auVar283,auVar314,auVar147);
          auVar78 = vfmadd231ps_fma(auVar292,auVar314,auVar148);
          auVar18 = vfmadd231ps_fma(auVar310,auVar314,auVar168);
          auVar314 = vsubps_avx(auVar324,auVar323);
          auVar323 = vsubps_avx(auVar78,auVar324);
          auVar324 = vsubps_avx(auVar18,auVar78);
          auVar311._0_4_ = local_218 * auVar323._0_4_;
          auVar311._4_4_ = local_218 * auVar323._4_4_;
          auVar311._8_4_ = local_218 * auVar323._8_4_;
          auVar311._12_4_ = local_218 * auVar323._12_4_;
          auVar249._4_4_ = fVar143;
          auVar249._0_4_ = fVar143;
          auVar249._8_4_ = fVar143;
          auVar249._12_4_ = fVar143;
          auVar314 = vfmadd231ps_fma(auVar311,auVar249,auVar314);
          auVar277._0_4_ = local_218 * auVar324._0_4_;
          auVar277._4_4_ = local_218 * auVar324._4_4_;
          auVar277._8_4_ = local_218 * auVar324._8_4_;
          auVar277._12_4_ = local_218 * auVar324._12_4_;
          auVar323 = vfmadd231ps_fma(auVar277,auVar249,auVar323);
          auVar278._0_4_ = local_218 * auVar323._0_4_;
          auVar278._4_4_ = local_218 * auVar323._4_4_;
          auVar278._8_4_ = local_218 * auVar323._8_4_;
          auVar278._12_4_ = local_218 * auVar323._12_4_;
          auVar323 = vfmadd231ps_fma(auVar278,auVar249,auVar314);
          local_348 = auVar100._0_4_;
          fStack_344 = auVar100._4_4_;
          fStack_340 = auVar100._8_4_;
          fStack_33c = auVar100._12_4_;
          auVar229._0_4_ = fVar165 * local_348;
          auVar229._4_4_ = fVar165 * fStack_344;
          auVar229._8_4_ = fVar165 * fStack_340;
          auVar229._12_4_ = fVar165 * fStack_33c;
          auVar181._4_4_ = fVar67;
          auVar181._0_4_ = fVar67;
          auVar181._8_4_ = fVar67;
          auVar181._12_4_ = fVar67;
          auVar314 = vfmadd132ps_fma(auVar181,auVar229,auVar99);
          auVar216._4_4_ = fVar145;
          auVar216._0_4_ = fVar145;
          auVar216._8_4_ = fVar145;
          auVar216._12_4_ = fVar145;
          auVar314 = vfmadd132ps_fma(auVar216,auVar314,auVar70);
          auVar230._0_4_ = auVar323._0_4_ * 3.0;
          auVar230._4_4_ = auVar323._4_4_ * 3.0;
          auVar230._8_4_ = auVar323._8_4_ * 3.0;
          auVar230._12_4_ = auVar323._12_4_ * 3.0;
          auVar198._4_4_ = fVar144;
          auVar198._0_4_ = fVar144;
          auVar198._8_4_ = fVar144;
          auVar198._12_4_ = fVar144;
          auVar323 = vfmadd132ps_fma(auVar198,auVar314,auVar146);
          auVar314 = vshufps_avx(auVar230,auVar230,0xc9);
          auVar182._0_4_ = auVar323._0_4_ * auVar314._0_4_;
          auVar182._4_4_ = auVar323._4_4_ * auVar314._4_4_;
          auVar182._8_4_ = auVar323._8_4_ * auVar314._8_4_;
          auVar182._12_4_ = auVar323._12_4_ * auVar314._12_4_;
          auVar314 = vshufps_avx(auVar323,auVar323,0xc9);
          auVar314 = vfmsub231ps_fma(auVar182,auVar230,auVar314);
          local_228 = auVar314._0_4_;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            *(float *)(ray + k * 4 + 0x80) = fVar164;
            uVar68 = vextractps_avx(auVar314,1);
            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar68;
            uVar68 = vextractps_avx(auVar314,2);
            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar68;
            *(undefined4 *)(ray + k * 4 + 0xe0) = local_228;
            *(float *)(ray + k * 4 + 0xf0) = local_218;
            *(float *)(ray + k * 4 + 0x100) = fVar95;
            *(uint *)(ray + k * 4 + 0x110) = uVar8;
            *(uint *)(ray + k * 4 + 0x120) = uVar58;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
          }
          else {
            auVar323 = vshufps_avx(auVar314,auVar314,0x55);
            auVar314 = vshufps_avx(auVar314,auVar314,0xaa);
            local_248[0] = (RTCHitN)auVar323[0];
            local_248[1] = (RTCHitN)auVar323[1];
            local_248[2] = (RTCHitN)auVar323[2];
            local_248[3] = (RTCHitN)auVar323[3];
            local_248[4] = (RTCHitN)auVar323[4];
            local_248[5] = (RTCHitN)auVar323[5];
            local_248[6] = (RTCHitN)auVar323[6];
            local_248[7] = (RTCHitN)auVar323[7];
            local_248[8] = (RTCHitN)auVar323[8];
            local_248[9] = (RTCHitN)auVar323[9];
            local_248[10] = (RTCHitN)auVar323[10];
            local_248[0xb] = (RTCHitN)auVar323[0xb];
            local_248[0xc] = (RTCHitN)auVar323[0xc];
            local_248[0xd] = (RTCHitN)auVar323[0xd];
            local_248[0xe] = (RTCHitN)auVar323[0xe];
            local_248[0xf] = (RTCHitN)auVar323[0xf];
            local_238 = auVar314;
            uStack_224 = local_228;
            uStack_220 = local_228;
            uStack_21c = local_228;
            fStack_214 = local_218;
            fStack_210 = local_218;
            fStack_20c = local_218;
            local_208 = auVar124;
            local_1f8 = CONCAT44(uVar8,uVar8);
            uStack_1f0 = CONCAT44(uVar8,uVar8);
            local_1e8._4_4_ = uVar58;
            local_1e8._0_4_ = uVar58;
            local_1e8._8_4_ = uVar58;
            local_1e8._12_4_ = uVar58;
            vpcmpeqd_avx2(ZEXT1632(local_1e8),ZEXT1632(local_1e8));
            uStack_1d4 = context->user->instID[0];
            local_1d8 = uStack_1d4;
            uStack_1d0 = uStack_1d4;
            uStack_1cc = uStack_1d4;
            uStack_1c8 = context->user->instPrimID[0];
            uStack_1c4 = uStack_1c8;
            uStack_1c0 = uStack_1c8;
            uStack_1bc = uStack_1c8;
            *(float *)(ray + k * 4 + 0x80) = fVar164;
            local_468 = *local_458;
            args.valid = (int *)local_468;
            args.geometryUserPtr = pGVar9->userPtr;
            args.context = context->user;
            args.hit = local_248;
            args.N = 4;
            args.ray = (RTCRayN *)ray;
            if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar9->intersectionFilterN)(&args);
              auVar129._8_56_ = extraout_var;
              auVar129._0_8_ = extraout_XMM1_Qa;
              auVar314 = auVar129._0_16_;
            }
            if (local_468 == (undefined1  [16])0x0) {
              auVar124 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
              auVar314 = vpcmpeqd_avx(auVar314,auVar314);
              auVar124 = auVar124 ^ auVar314;
            }
            else {
              p_Var15 = context->args->filter;
              auVar314 = vpcmpeqd_avx(auVar124,auVar124);
              if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                (*p_Var15)(&args);
                auVar314 = vpcmpeqd_avx(auVar314,auVar314);
              }
              auVar323 = vpcmpeqd_avx(local_468,_DAT_01f45a50);
              auVar124 = auVar323 ^ auVar314;
              if (local_468 != (undefined1  [16])0x0) {
                auVar323 = auVar323 ^ auVar314;
                auVar314 = vmaskmovps_avx(auVar323,*(undefined1 (*) [16])args.hit);
                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar314;
                auVar314 = vmaskmovps_avx(auVar323,*(undefined1 (*) [16])(args.hit + 0x10));
                *(undefined1 (*) [16])(args.ray + 0xd0) = auVar314;
                auVar314 = vmaskmovps_avx(auVar323,*(undefined1 (*) [16])(args.hit + 0x20));
                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar314;
                auVar314 = vmaskmovps_avx(auVar323,*(undefined1 (*) [16])(args.hit + 0x30));
                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar314;
                auVar314 = vmaskmovps_avx(auVar323,*(undefined1 (*) [16])(args.hit + 0x40));
                *(undefined1 (*) [16])(args.ray + 0x100) = auVar314;
                auVar314 = vmaskmovps_avx(auVar323,*(undefined1 (*) [16])(args.hit + 0x50));
                *(undefined1 (*) [16])(args.ray + 0x110) = auVar314;
                auVar314 = vmaskmovps_avx(auVar323,*(undefined1 (*) [16])(args.hit + 0x60));
                *(undefined1 (*) [16])(args.ray + 0x120) = auVar314;
                auVar314 = vmaskmovps_avx(auVar323,*(undefined1 (*) [16])(args.hit + 0x70));
                *(undefined1 (*) [16])(args.ray + 0x130) = auVar314;
                auVar314 = vmaskmovps_avx(auVar323,*(undefined1 (*) [16])(args.hit + 0x80));
                *(undefined1 (*) [16])(args.ray + 0x140) = auVar314;
              }
            }
            auVar90._8_8_ = 0x100000001;
            auVar90._0_8_ = 0x100000001;
            if ((auVar90 & auVar124) == (undefined1  [16])0x0) {
              *(float *)(ray + k * 4 + 0x80) = fVar166;
            }
          }
        }
      }
    }
    goto LAB_0123ac98;
  }
  auVar124 = vinsertps_avx(auVar124,ZEXT416((uint)fVar67),0x10);
  auVar78 = vinsertps_avx(auVar77,ZEXT416((uint)auVar103._0_4_),0x10);
  goto LAB_0123a6e5;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }